

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx::CurveNiIntersectorK<4,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar56;
  long lVar57;
  ulong uVar58;
  byte bVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar68 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar92;
  float fVar117;
  vint4 bi_1;
  undefined1 auVar94 [16];
  float fVar93;
  float fVar118;
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar96 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vint4 ai;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float t1;
  float fVar146;
  float fVar156;
  float fVar157;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar158;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar192;
  float fVar193;
  vint4 ai_2;
  undefined1 auVar177 [16];
  float fVar194;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar195;
  float fVar208;
  float fVar209;
  undefined1 auVar196 [16];
  float fVar210;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  vfloat4 b0;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  vint4 ai_1;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar240 [32];
  float fVar242;
  undefined1 auVar241 [32];
  float pp;
  float fVar246;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  float fVar255;
  float fVar266;
  float fVar267;
  vfloat4 a0_1;
  float fVar268;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar269;
  float fVar274;
  float fVar275;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar273 [64];
  float fVar281;
  float fVar285;
  float fVar286;
  undefined1 auVar282 [16];
  float fVar287;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar288;
  float fVar289;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar301;
  vfloat4 a0;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [16];
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar207 [32];
  undefined1 auVar294 [32];
  
  PVar8 = prim[1];
  uVar63 = (ulong)(byte)PVar8;
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar72 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar258 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar258 = vinsertps_avx(auVar258,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar176 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar72 = vsubps_avx(auVar72,*(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar119._0_4_ = fVar176 * auVar72._0_4_;
  auVar119._4_4_ = fVar176 * auVar72._4_4_;
  auVar119._8_4_ = fVar176 * auVar72._8_4_;
  auVar119._12_4_ = fVar176 * auVar72._12_4_;
  auVar211._0_4_ = fVar176 * auVar258._0_4_;
  auVar211._4_4_ = fVar176 * auVar258._4_4_;
  auVar211._8_4_ = fVar176 * auVar258._8_4_;
  auVar211._12_4_ = fVar176 * auVar258._12_4_;
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar258 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar63 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar64 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + uVar63 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  uVar64 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar128 = vshufps_avx(auVar211,auVar211,0);
  auVar99 = vshufps_avx(auVar211,auVar211,0x55);
  auVar120 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar176 = auVar120._0_4_;
  fVar146 = auVar120._4_4_;
  fVar192 = auVar120._8_4_;
  fVar156 = auVar120._12_4_;
  fVar195 = auVar99._0_4_;
  fVar208 = auVar99._4_4_;
  fVar209 = auVar99._8_4_;
  fVar210 = auVar99._12_4_;
  fVar193 = auVar128._0_4_;
  fVar157 = auVar128._4_4_;
  fVar194 = auVar128._8_4_;
  fVar158 = auVar128._12_4_;
  auVar270._0_4_ = fVar193 * auVar72._0_4_ + fVar195 * auVar258._0_4_ + fVar176 * auVar142._0_4_;
  auVar270._4_4_ = fVar157 * auVar72._4_4_ + fVar208 * auVar258._4_4_ + fVar146 * auVar142._4_4_;
  auVar270._8_4_ = fVar194 * auVar72._8_4_ + fVar209 * auVar258._8_4_ + fVar192 * auVar142._8_4_;
  auVar270._12_4_ = fVar158 * auVar72._12_4_ + fVar210 * auVar258._12_4_ + fVar156 * auVar142._12_4_
  ;
  auVar282._0_4_ = fVar193 * auVar15._0_4_ + fVar195 * auVar16._0_4_ + auVar17._0_4_ * fVar176;
  auVar282._4_4_ = fVar157 * auVar15._4_4_ + fVar208 * auVar16._4_4_ + auVar17._4_4_ * fVar146;
  auVar282._8_4_ = fVar194 * auVar15._8_4_ + fVar209 * auVar16._8_4_ + auVar17._8_4_ * fVar192;
  auVar282._12_4_ = fVar158 * auVar15._12_4_ + fVar210 * auVar16._12_4_ + auVar17._12_4_ * fVar156;
  auVar212._0_4_ = fVar193 * auVar65._0_4_ + fVar195 * auVar66._0_4_ + auVar98._0_4_ * fVar176;
  auVar212._4_4_ = fVar157 * auVar65._4_4_ + fVar208 * auVar66._4_4_ + auVar98._4_4_ * fVar146;
  auVar212._8_4_ = fVar194 * auVar65._8_4_ + fVar209 * auVar66._8_4_ + auVar98._8_4_ * fVar192;
  auVar212._12_4_ = fVar158 * auVar65._12_4_ + fVar210 * auVar66._12_4_ + auVar98._12_4_ * fVar156;
  auVar128 = vshufps_avx(auVar119,auVar119,0);
  auVar99 = vshufps_avx(auVar119,auVar119,0x55);
  auVar120 = vshufps_avx(auVar119,auVar119,0xaa);
  fVar176 = auVar120._0_4_;
  fVar146 = auVar120._4_4_;
  fVar192 = auVar120._8_4_;
  fVar156 = auVar120._12_4_;
  fVar195 = auVar99._0_4_;
  fVar208 = auVar99._4_4_;
  fVar209 = auVar99._8_4_;
  fVar210 = auVar99._12_4_;
  fVar193 = auVar128._0_4_;
  fVar157 = auVar128._4_4_;
  fVar194 = auVar128._8_4_;
  fVar158 = auVar128._12_4_;
  auVar159._0_4_ = fVar193 * auVar72._0_4_ + fVar195 * auVar258._0_4_ + fVar176 * auVar142._0_4_;
  auVar159._4_4_ = fVar157 * auVar72._4_4_ + fVar208 * auVar258._4_4_ + fVar146 * auVar142._4_4_;
  auVar159._8_4_ = fVar194 * auVar72._8_4_ + fVar209 * auVar258._8_4_ + fVar192 * auVar142._8_4_;
  auVar159._12_4_ = fVar158 * auVar72._12_4_ + fVar210 * auVar258._12_4_ + fVar156 * auVar142._12_4_
  ;
  auVar99._0_4_ = fVar193 * auVar15._0_4_ + auVar17._0_4_ * fVar176 + fVar195 * auVar16._0_4_;
  auVar99._4_4_ = fVar157 * auVar15._4_4_ + auVar17._4_4_ * fVar146 + fVar208 * auVar16._4_4_;
  auVar99._8_4_ = fVar194 * auVar15._8_4_ + auVar17._8_4_ * fVar192 + fVar209 * auVar16._8_4_;
  auVar99._12_4_ = fVar158 * auVar15._12_4_ + auVar17._12_4_ * fVar156 + fVar210 * auVar16._12_4_;
  auVar128._0_4_ = fVar193 * auVar65._0_4_ + fVar195 * auVar66._0_4_ + auVar98._0_4_ * fVar176;
  auVar128._4_4_ = fVar157 * auVar65._4_4_ + fVar208 * auVar66._4_4_ + auVar98._4_4_ * fVar146;
  auVar128._8_4_ = fVar194 * auVar65._8_4_ + fVar209 * auVar66._8_4_ + auVar98._8_4_ * fVar192;
  auVar128._12_4_ = fVar158 * auVar65._12_4_ + fVar210 * auVar66._12_4_ + auVar98._12_4_ * fVar156;
  auVar196._8_4_ = 0x7fffffff;
  auVar196._0_8_ = 0x7fffffff7fffffff;
  auVar196._12_4_ = 0x7fffffff;
  auVar72 = vandps_avx(auVar270,auVar196);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar72 = vcmpps_avx(auVar72,auVar147,1);
  auVar258 = vblendvps_avx(auVar270,auVar147,auVar72);
  auVar72 = vandps_avx(auVar282,auVar196);
  auVar72 = vcmpps_avx(auVar72,auVar147,1);
  auVar142 = vblendvps_avx(auVar282,auVar147,auVar72);
  auVar72 = vandps_avx(auVar212,auVar196);
  auVar72 = vcmpps_avx(auVar72,auVar147,1);
  auVar72 = vblendvps_avx(auVar212,auVar147,auVar72);
  auVar15 = vrcpps_avx(auVar258);
  fVar195 = auVar15._0_4_;
  auVar120._0_4_ = fVar195 * auVar258._0_4_;
  fVar208 = auVar15._4_4_;
  auVar120._4_4_ = fVar208 * auVar258._4_4_;
  fVar209 = auVar15._8_4_;
  auVar120._8_4_ = fVar209 * auVar258._8_4_;
  fVar210 = auVar15._12_4_;
  auVar120._12_4_ = fVar210 * auVar258._12_4_;
  auVar213._8_4_ = 0x3f800000;
  auVar213._0_8_ = 0x3f8000003f800000;
  auVar213._12_4_ = 0x3f800000;
  auVar258 = vsubps_avx(auVar213,auVar120);
  fVar195 = fVar195 + fVar195 * auVar258._0_4_;
  fVar208 = fVar208 + fVar208 * auVar258._4_4_;
  fVar209 = fVar209 + fVar209 * auVar258._8_4_;
  fVar210 = fVar210 + fVar210 * auVar258._12_4_;
  auVar258 = vrcpps_avx(auVar142);
  fVar176 = auVar258._0_4_;
  auVar177._0_4_ = fVar176 * auVar142._0_4_;
  fVar192 = auVar258._4_4_;
  auVar177._4_4_ = fVar192 * auVar142._4_4_;
  fVar193 = auVar258._8_4_;
  auVar177._8_4_ = fVar193 * auVar142._8_4_;
  fVar194 = auVar258._12_4_;
  auVar177._12_4_ = fVar194 * auVar142._12_4_;
  auVar258 = vsubps_avx(auVar213,auVar177);
  fVar176 = fVar176 + fVar176 * auVar258._0_4_;
  fVar192 = fVar192 + fVar192 * auVar258._4_4_;
  fVar193 = fVar193 + fVar193 * auVar258._8_4_;
  fVar194 = fVar194 + fVar194 * auVar258._12_4_;
  auVar258 = vrcpps_avx(auVar72);
  fVar146 = auVar258._0_4_;
  auVar148._0_4_ = fVar146 * auVar72._0_4_;
  fVar156 = auVar258._4_4_;
  auVar148._4_4_ = fVar156 * auVar72._4_4_;
  fVar157 = auVar258._8_4_;
  auVar148._8_4_ = fVar157 * auVar72._8_4_;
  fVar158 = auVar258._12_4_;
  auVar148._12_4_ = fVar158 * auVar72._12_4_;
  auVar72 = vsubps_avx(auVar213,auVar148);
  fVar146 = fVar146 + fVar146 * auVar72._0_4_;
  fVar156 = fVar156 + fVar156 * auVar72._4_4_;
  fVar157 = fVar157 + fVar157 * auVar72._8_4_;
  fVar158 = fVar158 + fVar158 * auVar72._12_4_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar72 = vpmovsxwd_avx(auVar72);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar159);
  auVar121._0_4_ = fVar195 * auVar72._0_4_;
  auVar121._4_4_ = fVar208 * auVar72._4_4_;
  auVar121._8_4_ = fVar209 * auVar72._8_4_;
  auVar121._12_4_ = fVar210 * auVar72._12_4_;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar72 = vpmovsxwd_avx(auVar258);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar159);
  auVar160._0_4_ = fVar195 * auVar72._0_4_;
  auVar160._4_4_ = fVar208 * auVar72._4_4_;
  auVar160._8_4_ = fVar209 * auVar72._8_4_;
  auVar160._12_4_ = fVar210 * auVar72._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar258 = vpmovsxwd_avx(auVar142);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar63 * -2 + 6);
  auVar72 = vpmovsxwd_avx(auVar15);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar99);
  auVar223._0_4_ = auVar72._0_4_ * fVar176;
  auVar223._4_4_ = auVar72._4_4_ * fVar192;
  auVar223._8_4_ = auVar72._8_4_ * fVar193;
  auVar223._12_4_ = auVar72._12_4_ * fVar194;
  auVar72 = vcvtdq2ps_avx(auVar258);
  auVar72 = vsubps_avx(auVar72,auVar99);
  auVar98._0_4_ = fVar176 * auVar72._0_4_;
  auVar98._4_4_ = fVar192 * auVar72._4_4_;
  auVar98._8_4_ = fVar193 * auVar72._8_4_;
  auVar98._12_4_ = fVar194 * auVar72._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar64 + uVar63 + 6);
  auVar72 = vpmovsxwd_avx(auVar16);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar128);
  auVar178._0_4_ = auVar72._0_4_ * fVar146;
  auVar178._4_4_ = auVar72._4_4_ * fVar156;
  auVar178._8_4_ = auVar72._8_4_ * fVar157;
  auVar178._12_4_ = auVar72._12_4_ * fVar158;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar72 = vpmovsxwd_avx(auVar17);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar128);
  auVar65._0_4_ = auVar72._0_4_ * fVar146;
  auVar65._4_4_ = auVar72._4_4_ * fVar156;
  auVar65._8_4_ = auVar72._8_4_ * fVar157;
  auVar65._12_4_ = auVar72._12_4_ * fVar158;
  auVar72 = vpminsd_avx(auVar121,auVar160);
  auVar258 = vpminsd_avx(auVar223,auVar98);
  auVar72 = vmaxps_avx(auVar72,auVar258);
  auVar258 = vpminsd_avx(auVar178,auVar65);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar230._4_4_ = uVar6;
  auVar230._0_4_ = uVar6;
  auVar230._8_4_ = uVar6;
  auVar230._12_4_ = uVar6;
  auVar258 = vmaxps_avx(auVar258,auVar230);
  auVar72 = vmaxps_avx(auVar72,auVar258);
  local_470._0_4_ = auVar72._0_4_ * 0.99999964;
  local_470._4_4_ = auVar72._4_4_ * 0.99999964;
  local_470._8_4_ = auVar72._8_4_ * 0.99999964;
  local_470._12_4_ = auVar72._12_4_ * 0.99999964;
  auVar72 = vpmaxsd_avx(auVar121,auVar160);
  auVar258 = vpmaxsd_avx(auVar223,auVar98);
  auVar72 = vminps_avx(auVar72,auVar258);
  auVar258 = vpmaxsd_avx(auVar178,auVar65);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar122._4_4_ = uVar6;
  auVar122._0_4_ = uVar6;
  auVar122._8_4_ = uVar6;
  auVar122._12_4_ = uVar6;
  auVar258 = vminps_avx(auVar258,auVar122);
  auVar72 = vminps_avx(auVar72,auVar258);
  auVar66._0_4_ = auVar72._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar72._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar72._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar72._12_4_ * 1.0000004;
  auVar72 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar258 = vpcmpgtd_avx(auVar72,_DAT_01f7fcf0);
  auVar72 = vcmpps_avx(local_470,auVar66,2);
  auVar72 = vandps_avx(auVar72,auVar258);
  uVar56 = vmovmskps_avx(auVar72);
  if (uVar56 == 0) {
    return;
  }
  uVar56 = uVar56 & 0xff;
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  uVar61 = 1 << ((byte)k & 0x1f);
  do {
    uVar64 = (ulong)uVar56;
    lVar57 = 0;
    if (uVar64 != 0) {
      for (; (uVar56 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
      }
    }
    uVar56 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar57 * 4 + 6);
    pGVar10 = (context->scene->geometries).items[uVar56].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var11 = pGVar10[1].intersectionFilterN;
    pvVar12 = pGVar10[2].userPtr;
    _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    pfVar1 = (float *)(_Var13 + uVar63 * (long)pvVar12);
    fVar176 = *pfVar1;
    fVar146 = pfVar1[1];
    fVar192 = pfVar1[2];
    fVar156 = pfVar1[3];
    pfVar1 = (float *)(_Var13 + (uVar63 + 1) * (long)pvVar12);
    pfVar2 = (float *)(_Var13 + (uVar63 + 2) * (long)pvVar12);
    pfVar3 = (float *)(_Var13 + (long)pvVar12 * (uVar63 + 3));
    fVar193 = *pfVar3;
    fVar157 = pfVar3[1];
    fVar194 = pfVar3[2];
    fVar158 = pfVar3[3];
    uVar64 = uVar64 - 1 & uVar64;
    lVar57 = *(long *)&pGVar10[1].time_range.upper;
    pfVar3 = (float *)(lVar57 + (long)p_Var11 * uVar63);
    fVar195 = *pfVar3;
    fVar208 = pfVar3[1];
    fVar209 = pfVar3[2];
    fVar210 = pfVar3[3];
    pfVar3 = (float *)(lVar57 + (long)p_Var11 * (uVar63 + 1));
    pfVar4 = (float *)(lVar57 + (long)p_Var11 * (uVar63 + 2));
    lVar14 = 0;
    if (uVar64 != 0) {
      for (; (uVar64 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
      }
    }
    pfVar5 = (float *)(lVar57 + (long)p_Var11 * (uVar63 + 3));
    fVar92 = *pfVar5;
    fVar93 = pfVar5[1];
    fVar117 = pfVar5[2];
    fVar118 = pfVar5[3];
    if (((uVar64 != 0) && (uVar63 = uVar64 - 1 & uVar64, uVar63 != 0)) && (lVar57 = 0, uVar63 != 0))
    {
      for (; (uVar63 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
      }
    }
    auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar142 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    fVar246 = *pfVar4 * 0.0;
    fVar252 = pfVar4[1] * 0.0;
    fVar253 = pfVar4[2] * 0.0;
    fVar254 = pfVar4[3] * 0.0;
    fVar255 = fVar246 + fVar92 * 0.0;
    fVar266 = fVar252 + fVar93 * 0.0;
    fVar267 = fVar253 + fVar117 * 0.0;
    fVar268 = fVar254 + fVar118 * 0.0;
    fVar269 = *pfVar3 * 0.0;
    fVar274 = pfVar3[1] * 0.0;
    fVar275 = pfVar3[2] * 0.0;
    fVar276 = pfVar3[3] * 0.0;
    local_6f0._0_4_ = fVar195 + fVar269 + fVar255;
    local_6f0._4_4_ = fVar208 + fVar274 + fVar266;
    fStack_6e8 = fVar209 + fVar275 + fVar267;
    fStack_6e4 = fVar210 + fVar276 + fVar268;
    auVar123._0_4_ = fVar255 + *pfVar3 * 3.0;
    auVar123._4_4_ = fVar266 + pfVar3[1] * 3.0;
    auVar123._8_4_ = fVar267 + pfVar3[2] * 3.0;
    auVar123._12_4_ = fVar268 + pfVar3[3] * 3.0;
    auVar256._0_4_ = fVar195 * 3.0;
    auVar256._4_4_ = fVar208 * 3.0;
    auVar256._8_4_ = fVar209 * 3.0;
    auVar256._12_4_ = fVar210 * 3.0;
    auVar98 = vsubps_avx(auVar123,auVar256);
    fVar281 = *pfVar2 * 0.0;
    fVar285 = pfVar2[1] * 0.0;
    fVar286 = pfVar2[2] * 0.0;
    fVar287 = pfVar2[3] * 0.0;
    fVar255 = fVar281 + fVar193 * 0.0;
    fVar266 = fVar285 + fVar157 * 0.0;
    fVar267 = fVar286 + fVar194 * 0.0;
    fVar268 = fVar287 + fVar158 * 0.0;
    fVar289 = *pfVar1 * 0.0;
    fVar295 = pfVar1[1] * 0.0;
    fVar296 = pfVar1[2] * 0.0;
    fVar297 = pfVar1[3] * 0.0;
    auVar298._0_4_ = fVar289 + fVar255 + fVar176;
    auVar298._4_4_ = fVar295 + fVar266 + fVar146;
    auVar298._8_4_ = fVar296 + fVar267 + fVar192;
    auVar298._12_4_ = fVar297 + fVar268 + fVar156;
    auVar149._0_4_ = fVar255 + *pfVar1 * 3.0;
    auVar149._4_4_ = fVar266 + pfVar1[1] * 3.0;
    auVar149._8_4_ = fVar267 + pfVar1[2] * 3.0;
    auVar149._12_4_ = fVar268 + pfVar1[3] * 3.0;
    auVar257._0_4_ = fVar176 * 3.0;
    auVar257._4_4_ = fVar146 * 3.0;
    auVar257._8_4_ = fVar192 * 3.0;
    auVar257._12_4_ = fVar156 * 3.0;
    auVar16 = vsubps_avx(auVar149,auVar257);
    auVar224._0_4_ = fVar195 * 0.0;
    auVar224._4_4_ = fVar208 * 0.0;
    auVar224._8_4_ = fVar209 * 0.0;
    auVar224._12_4_ = fVar210 * 0.0;
    auVar150._0_4_ = auVar224._0_4_ + fVar269 + fVar246 + fVar92;
    auVar150._4_4_ = auVar224._4_4_ + fVar274 + fVar252 + fVar93;
    auVar150._8_4_ = auVar224._8_4_ + fVar275 + fVar253 + fVar117;
    auVar150._12_4_ = auVar224._12_4_ + fVar276 + fVar254 + fVar118;
    auVar231._0_4_ = fVar92 * 3.0;
    auVar231._4_4_ = fVar93 * 3.0;
    auVar231._8_4_ = fVar117 * 3.0;
    auVar231._12_4_ = fVar118 * 3.0;
    auVar161._0_4_ = *pfVar4 * 3.0;
    auVar161._4_4_ = pfVar4[1] * 3.0;
    auVar161._8_4_ = pfVar4[2] * 3.0;
    auVar161._12_4_ = pfVar4[3] * 3.0;
    auVar72 = vsubps_avx(auVar231,auVar161);
    auVar162._0_4_ = fVar269 + auVar72._0_4_;
    auVar162._4_4_ = fVar274 + auVar72._4_4_;
    auVar162._8_4_ = fVar275 + auVar72._8_4_;
    auVar162._12_4_ = fVar276 + auVar72._12_4_;
    auVar128 = vsubps_avx(auVar162,auVar224);
    auVar179._0_4_ = fVar176 * 0.0;
    auVar179._4_4_ = fVar146 * 0.0;
    auVar179._8_4_ = fVar192 * 0.0;
    auVar179._12_4_ = fVar156 * 0.0;
    auVar232._0_4_ = fVar289 + fVar281 + fVar193 + auVar179._0_4_;
    auVar232._4_4_ = fVar295 + fVar285 + fVar157 + auVar179._4_4_;
    auVar232._8_4_ = fVar296 + fVar286 + fVar194 + auVar179._8_4_;
    auVar232._12_4_ = fVar297 + fVar287 + fVar158 + auVar179._12_4_;
    auVar214._0_4_ = fVar193 * 3.0;
    auVar214._4_4_ = fVar157 * 3.0;
    auVar214._8_4_ = fVar194 * 3.0;
    auVar214._12_4_ = fVar158 * 3.0;
    auVar197._0_4_ = *pfVar2 * 3.0;
    auVar197._4_4_ = pfVar2[1] * 3.0;
    auVar197._8_4_ = pfVar2[2] * 3.0;
    auVar197._12_4_ = pfVar2[3] * 3.0;
    auVar72 = vsubps_avx(auVar214,auVar197);
    auVar198._0_4_ = fVar289 + auVar72._0_4_;
    auVar198._4_4_ = fVar295 + auVar72._4_4_;
    auVar198._8_4_ = fVar296 + auVar72._8_4_;
    auVar198._12_4_ = fVar297 + auVar72._12_4_;
    auVar65 = vsubps_avx(auVar198,auVar179);
    auVar72 = vshufps_avx(auVar98,auVar98,0xc9);
    auVar258 = vshufps_avx(auVar298,auVar298,0xc9);
    fVar246 = auVar98._0_4_;
    auVar215._0_4_ = fVar246 * auVar258._0_4_;
    fVar252 = auVar98._4_4_;
    auVar215._4_4_ = fVar252 * auVar258._4_4_;
    fVar253 = auVar98._8_4_;
    auVar215._8_4_ = fVar253 * auVar258._8_4_;
    fVar254 = auVar98._12_4_;
    auVar215._12_4_ = fVar254 * auVar258._12_4_;
    auVar225._0_4_ = auVar298._0_4_ * auVar72._0_4_;
    auVar225._4_4_ = auVar298._4_4_ * auVar72._4_4_;
    auVar225._8_4_ = auVar298._8_4_ * auVar72._8_4_;
    auVar225._12_4_ = auVar298._12_4_ * auVar72._12_4_;
    auVar258 = vsubps_avx(auVar225,auVar215);
    auVar15 = vshufps_avx(auVar258,auVar258,0xc9);
    auVar258 = vshufps_avx(auVar16,auVar16,0xc9);
    auVar216._0_4_ = fVar246 * auVar258._0_4_;
    auVar216._4_4_ = fVar252 * auVar258._4_4_;
    auVar216._8_4_ = fVar253 * auVar258._8_4_;
    auVar216._12_4_ = fVar254 * auVar258._12_4_;
    auVar180._0_4_ = auVar16._0_4_ * auVar72._0_4_;
    auVar180._4_4_ = auVar16._4_4_ * auVar72._4_4_;
    auVar180._8_4_ = auVar16._8_4_ * auVar72._8_4_;
    auVar180._12_4_ = auVar16._12_4_ * auVar72._12_4_;
    auVar72 = vsubps_avx(auVar180,auVar216);
    auVar16 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar72 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar258 = vshufps_avx(auVar232,auVar232,0xc9);
    fVar255 = auVar128._0_4_;
    auVar181._0_4_ = fVar255 * auVar258._0_4_;
    fVar266 = auVar128._4_4_;
    auVar181._4_4_ = fVar266 * auVar258._4_4_;
    fVar267 = auVar128._8_4_;
    auVar181._8_4_ = fVar267 * auVar258._8_4_;
    fVar268 = auVar128._12_4_;
    auVar181._12_4_ = fVar268 * auVar258._12_4_;
    auVar233._0_4_ = auVar232._0_4_ * auVar72._0_4_;
    auVar233._4_4_ = auVar232._4_4_ * auVar72._4_4_;
    auVar233._8_4_ = auVar232._8_4_ * auVar72._8_4_;
    auVar233._12_4_ = auVar232._12_4_ * auVar72._12_4_;
    auVar258 = vsubps_avx(auVar233,auVar181);
    auVar17 = vshufps_avx(auVar258,auVar258,0xc9);
    auVar258 = vshufps_avx(auVar65,auVar65,0xc9);
    auVar234._0_4_ = auVar258._0_4_ * fVar255;
    auVar234._4_4_ = auVar258._4_4_ * fVar266;
    auVar234._8_4_ = auVar258._8_4_ * fVar267;
    auVar234._12_4_ = auVar258._12_4_ * fVar268;
    auVar199._0_4_ = auVar72._0_4_ * auVar65._0_4_;
    auVar199._4_4_ = auVar72._4_4_ * auVar65._4_4_;
    auVar199._8_4_ = auVar72._8_4_ * auVar65._8_4_;
    auVar199._12_4_ = auVar72._12_4_ * auVar65._12_4_;
    auVar72 = vsubps_avx(auVar199,auVar234);
    auVar65 = vshufps_avx(auVar72,auVar72,0xc9);
    auVar72 = vdpps_avx(auVar15,auVar15,0x7f);
    fVar193 = auVar72._0_4_;
    auVar120 = ZEXT416((uint)fVar193);
    auVar258 = vrsqrtss_avx(auVar120,auVar120);
    fVar176 = auVar258._0_4_;
    auVar258 = vdpps_avx(auVar15,auVar16,0x7f);
    auVar66 = ZEXT416((uint)(fVar176 * 1.5 - fVar193 * 0.5 * fVar176 * fVar176 * fVar176));
    auVar66 = vshufps_avx(auVar66,auVar66,0);
    fVar176 = auVar15._0_4_ * auVar66._0_4_;
    fVar146 = auVar15._4_4_ * auVar66._4_4_;
    fVar192 = auVar15._8_4_ * auVar66._8_4_;
    fVar156 = auVar15._12_4_ * auVar66._12_4_;
    auVar72 = vshufps_avx(auVar72,auVar72,0);
    auVar247._0_4_ = auVar16._0_4_ * auVar72._0_4_;
    auVar247._4_4_ = auVar16._4_4_ * auVar72._4_4_;
    auVar247._8_4_ = auVar16._8_4_ * auVar72._8_4_;
    auVar247._12_4_ = auVar16._12_4_ * auVar72._12_4_;
    auVar72 = vshufps_avx(auVar258,auVar258,0);
    auVar226._0_4_ = auVar15._0_4_ * auVar72._0_4_;
    auVar226._4_4_ = auVar15._4_4_ * auVar72._4_4_;
    auVar226._8_4_ = auVar15._8_4_ * auVar72._8_4_;
    auVar226._12_4_ = auVar15._12_4_ * auVar72._12_4_;
    auVar99 = vsubps_avx(auVar247,auVar226);
    auVar72 = vrcpss_avx(auVar120,auVar120);
    auVar72 = ZEXT416((uint)(auVar72._0_4_ * (2.0 - fVar193 * auVar72._0_4_)));
    auVar15 = vshufps_avx(auVar72,auVar72,0);
    auVar72 = vdpps_avx(auVar17,auVar17,0x7f);
    fVar193 = auVar72._0_4_;
    auVar120 = ZEXT416((uint)fVar193);
    auVar258 = vrsqrtss_avx(auVar120,auVar120);
    fVar157 = auVar258._0_4_;
    auVar258 = ZEXT416((uint)(fVar157 * 1.5 - fVar193 * 0.5 * fVar157 * fVar157 * fVar157));
    auVar16 = vshufps_avx(auVar258,auVar258,0);
    fVar157 = auVar16._0_4_ * auVar17._0_4_;
    fVar194 = auVar16._4_4_ * auVar17._4_4_;
    fVar158 = auVar16._8_4_ * auVar17._8_4_;
    fVar195 = auVar16._12_4_ * auVar17._12_4_;
    auVar258 = vdpps_avx(auVar17,auVar65,0x7f);
    auVar72 = vshufps_avx(auVar72,auVar72,0);
    auVar217._0_4_ = auVar72._0_4_ * auVar65._0_4_;
    auVar217._4_4_ = auVar72._4_4_ * auVar65._4_4_;
    auVar217._8_4_ = auVar72._8_4_ * auVar65._8_4_;
    auVar217._12_4_ = auVar72._12_4_ * auVar65._12_4_;
    auVar72 = vshufps_avx(auVar258,auVar258,0);
    auVar182._0_4_ = auVar72._0_4_ * auVar17._0_4_;
    auVar182._4_4_ = auVar72._4_4_ * auVar17._4_4_;
    auVar182._8_4_ = auVar72._8_4_ * auVar17._8_4_;
    auVar182._12_4_ = auVar72._12_4_ * auVar17._12_4_;
    auVar65 = vsubps_avx(auVar217,auVar182);
    auVar72 = vrcpss_avx(auVar120,auVar120);
    auVar72 = ZEXT416((uint)((2.0 - fVar193 * auVar72._0_4_) * auVar72._0_4_));
    auVar72 = vshufps_avx(auVar72,auVar72,0);
    auVar258 = vshufps_avx(_local_6f0,_local_6f0,0xff);
    auVar235._0_4_ = auVar258._0_4_ * fVar176;
    auVar235._4_4_ = auVar258._4_4_ * fVar146;
    auVar235._8_4_ = auVar258._8_4_ * fVar192;
    auVar235._12_4_ = auVar258._12_4_ * fVar156;
    _local_490 = vsubps_avx(_local_6f0,auVar235);
    auVar17 = vshufps_avx(auVar98,auVar98,0xff);
    auVar200._0_4_ =
         auVar17._0_4_ * fVar176 + auVar66._0_4_ * auVar99._0_4_ * auVar15._0_4_ * auVar258._0_4_;
    auVar200._4_4_ =
         auVar17._4_4_ * fVar146 + auVar66._4_4_ * auVar99._4_4_ * auVar15._4_4_ * auVar258._4_4_;
    auVar200._8_4_ =
         auVar17._8_4_ * fVar192 + auVar66._8_4_ * auVar99._8_4_ * auVar15._8_4_ * auVar258._8_4_;
    auVar200._12_4_ =
         auVar17._12_4_ * fVar156 +
         auVar66._12_4_ * auVar99._12_4_ * auVar15._12_4_ * auVar258._12_4_;
    auVar17 = vsubps_avx(auVar98,auVar200);
    local_4a0._0_4_ = auVar235._0_4_ + (float)local_6f0._0_4_;
    local_4a0._4_4_ = auVar235._4_4_ + (float)local_6f0._4_4_;
    fStack_498 = auVar235._8_4_ + fStack_6e8;
    fStack_494 = auVar235._12_4_ + fStack_6e4;
    auVar258 = vshufps_avx(auVar150,auVar150,0xff);
    auVar124._0_4_ = fVar157 * auVar258._0_4_;
    auVar124._4_4_ = fVar194 * auVar258._4_4_;
    auVar124._8_4_ = fVar158 * auVar258._8_4_;
    auVar124._12_4_ = fVar195 * auVar258._12_4_;
    _local_4b0 = vsubps_avx(auVar150,auVar124);
    auVar15 = vshufps_avx(auVar128,auVar128,0xff);
    auVar94._0_4_ =
         fVar157 * auVar15._0_4_ + auVar258._0_4_ * auVar16._0_4_ * auVar65._0_4_ * auVar72._0_4_;
    auVar94._4_4_ =
         fVar194 * auVar15._4_4_ + auVar258._4_4_ * auVar16._4_4_ * auVar65._4_4_ * auVar72._4_4_;
    auVar94._8_4_ =
         fVar158 * auVar15._8_4_ + auVar258._8_4_ * auVar16._8_4_ * auVar65._8_4_ * auVar72._8_4_;
    auVar94._12_4_ =
         fVar195 * auVar15._12_4_ +
         auVar258._12_4_ * auVar16._12_4_ * auVar65._12_4_ * auVar72._12_4_;
    auVar16 = vsubps_avx(auVar128,auVar94);
    local_4c0._0_4_ = auVar150._0_4_ + auVar124._0_4_;
    local_4c0._4_4_ = auVar150._4_4_ + auVar124._4_4_;
    fStack_4b8 = auVar150._8_4_ + auVar124._8_4_;
    fStack_4b4 = auVar150._12_4_ + auVar124._12_4_;
    local_4d0._0_4_ = local_490._0_4_ + auVar17._0_4_ * 0.33333334;
    local_4d0._4_4_ = local_490._4_4_ + auVar17._4_4_ * 0.33333334;
    fStack_4c8 = local_490._8_4_ + auVar17._8_4_ * 0.33333334;
    fStack_4c4 = local_490._12_4_ + auVar17._12_4_ * 0.33333334;
    local_390 = vsubps_avx(_local_490,auVar142);
    auVar258 = vmovsldup_avx(local_390);
    auVar72 = vmovshdup_avx(local_390);
    auVar15 = vshufps_avx(local_390,local_390,0xaa);
    fVar176 = pre->ray_space[k].vx.field_0.m128[0];
    fVar146 = pre->ray_space[k].vx.field_0.m128[1];
    fVar192 = pre->ray_space[k].vx.field_0.m128[2];
    fVar156 = pre->ray_space[k].vx.field_0.m128[3];
    fVar193 = pre->ray_space[k].vy.field_0.m128[0];
    fVar157 = pre->ray_space[k].vy.field_0.m128[1];
    fVar194 = pre->ray_space[k].vy.field_0.m128[2];
    fVar158 = pre->ray_space[k].vy.field_0.m128[3];
    fVar195 = pre->ray_space[k].vz.field_0.m128[0];
    fVar208 = pre->ray_space[k].vz.field_0.m128[1];
    fVar209 = pre->ray_space[k].vz.field_0.m128[2];
    fVar210 = pre->ray_space[k].vz.field_0.m128[3];
    fVar92 = fVar176 * auVar258._0_4_ + auVar15._0_4_ * fVar195 + fVar193 * auVar72._0_4_;
    fVar117 = fVar146 * auVar258._4_4_ + auVar15._4_4_ * fVar208 + fVar157 * auVar72._4_4_;
    local_6f0._4_4_ = fVar117;
    local_6f0._0_4_ = fVar92;
    fStack_6e8 = fVar192 * auVar258._8_4_ + auVar15._8_4_ * fVar209 + fVar194 * auVar72._8_4_;
    fStack_6e4 = fVar156 * auVar258._12_4_ + auVar15._12_4_ * fVar210 + fVar158 * auVar72._12_4_;
    local_3a0 = vsubps_avx(_local_4d0,auVar142);
    auVar15 = vshufps_avx(local_3a0,local_3a0,0xaa);
    auVar72 = vmovshdup_avx(local_3a0);
    auVar258 = vmovsldup_avx(local_3a0);
    fVar93 = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + fVar195 * auVar15._0_4_;
    fVar118 = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + fVar208 * auVar15._4_4_;
    local_5b0._4_4_ = fVar118;
    local_5b0._0_4_ = fVar93;
    fStack_5a8 = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + fVar209 * auVar15._8_4_;
    fStack_5a4 = auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + fVar210 * auVar15._12_4_;
    auVar183._0_4_ = auVar16._0_4_ * 0.33333334;
    auVar183._4_4_ = auVar16._4_4_ * 0.33333334;
    auVar183._8_4_ = auVar16._8_4_ * 0.33333334;
    auVar183._12_4_ = auVar16._12_4_ * 0.33333334;
    _local_4e0 = vsubps_avx(_local_4b0,auVar183);
    local_3b0 = vsubps_avx(_local_4e0,auVar142);
    auVar15 = vshufps_avx(local_3b0,local_3b0,0xaa);
    auVar72 = vmovshdup_avx(local_3b0);
    auVar258 = vmovsldup_avx(local_3b0);
    auVar299._0_4_ = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + fVar195 * auVar15._0_4_;
    auVar299._4_4_ = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + fVar208 * auVar15._4_4_;
    auVar299._8_4_ = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + fVar209 * auVar15._8_4_;
    auVar299._12_4_ =
         auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + fVar210 * auVar15._12_4_;
    local_3c0 = vsubps_avx(_local_4b0,auVar142);
    auVar15 = vshufps_avx(local_3c0,local_3c0,0xaa);
    auVar72 = vmovshdup_avx(local_3c0);
    auVar258 = vmovsldup_avx(local_3c0);
    auVar290._0_4_ = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + auVar15._0_4_ * fVar195;
    auVar290._4_4_ = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + auVar15._4_4_ * fVar208;
    auVar290._8_4_ = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + auVar15._8_4_ * fVar209;
    auVar290._12_4_ =
         auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + auVar15._12_4_ * fVar210;
    local_3d0 = vsubps_avx(_local_4a0,auVar142);
    auVar15 = vshufps_avx(local_3d0,local_3d0,0xaa);
    auVar72 = vmovshdup_avx(local_3d0);
    auVar258 = vmovsldup_avx(local_3d0);
    auVar283._0_4_ = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + auVar15._0_4_ * fVar195;
    auVar283._4_4_ = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + auVar15._4_4_ * fVar208;
    auVar283._8_4_ = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + auVar15._8_4_ * fVar209;
    auVar283._12_4_ =
         auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + auVar15._12_4_ * fVar210;
    local_4f0._0_4_ = (fVar246 + auVar200._0_4_) * 0.33333334 + (float)local_4a0._0_4_;
    local_4f0._4_4_ = (fVar252 + auVar200._4_4_) * 0.33333334 + (float)local_4a0._4_4_;
    fStack_4e8 = (fVar253 + auVar200._8_4_) * 0.33333334 + fStack_498;
    fStack_4e4 = (fVar254 + auVar200._12_4_) * 0.33333334 + fStack_494;
    local_3e0 = vsubps_avx(_local_4f0,auVar142);
    auVar15 = vshufps_avx(local_3e0,local_3e0,0xaa);
    auVar72 = vmovshdup_avx(local_3e0);
    auVar258 = vmovsldup_avx(local_3e0);
    auVar236._0_4_ = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + auVar15._0_4_ * fVar195;
    auVar236._4_4_ = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + auVar15._4_4_ * fVar208;
    auVar236._8_4_ = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + auVar15._8_4_ * fVar209;
    auVar236._12_4_ =
         auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + auVar15._12_4_ * fVar210;
    auVar218._0_4_ = (fVar255 + auVar94._0_4_) * 0.33333334;
    auVar218._4_4_ = (fVar266 + auVar94._4_4_) * 0.33333334;
    auVar218._8_4_ = (fVar267 + auVar94._8_4_) * 0.33333334;
    auVar218._12_4_ = (fVar268 + auVar94._12_4_) * 0.33333334;
    _local_420 = vsubps_avx(_local_4c0,auVar218);
    local_3f0 = vsubps_avx(_local_420,auVar142);
    auVar15 = vshufps_avx(local_3f0,local_3f0,0xaa);
    auVar72 = vmovshdup_avx(local_3f0);
    auVar258 = vmovsldup_avx(local_3f0);
    auVar95._0_4_ = auVar258._0_4_ * fVar176 + auVar72._0_4_ * fVar193 + fVar195 * auVar15._0_4_;
    auVar95._4_4_ = auVar258._4_4_ * fVar146 + auVar72._4_4_ * fVar157 + fVar208 * auVar15._4_4_;
    auVar95._8_4_ = auVar258._8_4_ * fVar192 + auVar72._8_4_ * fVar194 + fVar209 * auVar15._8_4_;
    auVar95._12_4_ = auVar258._12_4_ * fVar156 + auVar72._12_4_ * fVar158 + fVar210 * auVar15._12_4_
    ;
    local_400 = vsubps_avx(_local_4c0,auVar142);
    auVar142 = vshufps_avx(local_400,local_400,0xaa);
    auVar72 = vmovshdup_avx(local_400);
    auVar258 = vmovsldup_avx(local_400);
    auVar67._0_4_ = fVar176 * auVar258._0_4_ + fVar193 * auVar72._0_4_ + fVar195 * auVar142._0_4_;
    auVar67._4_4_ = fVar146 * auVar258._4_4_ + fVar157 * auVar72._4_4_ + fVar208 * auVar142._4_4_;
    auVar67._8_4_ = fVar192 * auVar258._8_4_ + fVar194 * auVar72._8_4_ + fVar209 * auVar142._8_4_;
    auVar67._12_4_ =
         fVar156 * auVar258._12_4_ + fVar158 * auVar72._12_4_ + fVar210 * auVar142._12_4_;
    auVar15 = vmovlhps_avx(_local_6f0,auVar283);
    auVar16 = vmovlhps_avx(_local_5b0,auVar236);
    auVar17 = vmovlhps_avx(auVar299,auVar95);
    auVar65 = vmovlhps_avx(auVar290,auVar67);
    auVar72 = vminps_avx(auVar15,auVar16);
    auVar258 = vminps_avx(auVar17,auVar65);
    auVar142 = vminps_avx(auVar72,auVar258);
    auVar72 = vmaxps_avx(auVar15,auVar16);
    auVar258 = vmaxps_avx(auVar17,auVar65);
    auVar72 = vmaxps_avx(auVar72,auVar258);
    auVar258 = vshufpd_avx(auVar142,auVar142,3);
    auVar142 = vminps_avx(auVar142,auVar258);
    auVar258 = vshufpd_avx(auVar72,auVar72,3);
    auVar258 = vmaxps_avx(auVar72,auVar258);
    auVar201._8_4_ = 0x7fffffff;
    auVar201._0_8_ = 0x7fffffff7fffffff;
    auVar201._12_4_ = 0x7fffffff;
    auVar72 = vandps_avx(auVar142,auVar201);
    auVar258 = vandps_avx(auVar258,auVar201);
    auVar72 = vmaxps_avx(auVar72,auVar258);
    auVar258 = vmovshdup_avx(auVar72);
    auVar72 = vmaxss_avx(auVar258,auVar72);
    fVar176 = auVar72._0_4_ * 9.536743e-07;
    local_350 = ZEXT416((uint)fVar176);
    auVar72 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
    local_320._16_16_ = auVar72;
    local_320._0_16_ = auVar72;
    auVar68._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
    auVar68._8_4_ = auVar72._8_4_ ^ 0x80000000;
    auVar68._12_4_ = auVar72._12_4_ ^ 0x80000000;
    local_340._16_16_ = auVar68;
    local_340._0_16_ = auVar68;
    auVar72 = vpshufd_avx(ZEXT416(uVar56),0);
    local_2c0._16_16_ = auVar72;
    local_2c0._0_16_ = auVar72;
    auVar72 = vpshufd_avx(ZEXT416(uVar9),0);
    local_2e0._16_16_ = auVar72;
    local_2e0._0_16_ = auVar72;
    uVar60 = 0;
    fVar176 = *(float *)(ray + k * 4 + 0x60);
    _local_360 = vsubps_avx(auVar16,auVar15);
    _local_370 = vsubps_avx(auVar17,auVar16);
    _local_380 = vsubps_avx(auVar65,auVar17);
    _local_430 = vsubps_avx(_local_4a0,_local_490);
    _local_440 = vsubps_avx(_local_4f0,_local_4d0);
    _local_450 = vsubps_avx(_local_420,_local_4e0);
    _local_460 = vsubps_avx(_local_4c0,_local_4b0);
    auVar265 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar273 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00e0fc72:
    auVar122 = auVar265._0_16_;
    auVar147 = auVar273._0_16_;
    local_410 = auVar147;
    auVar72 = vshufps_avx(auVar122,auVar122,0x50);
    auVar291._8_4_ = 0x3f800000;
    auVar291._0_8_ = 0x3f8000003f800000;
    auVar291._12_4_ = 0x3f800000;
    auVar294._16_4_ = 0x3f800000;
    auVar294._0_16_ = auVar291;
    auVar294._20_4_ = 0x3f800000;
    auVar294._24_4_ = 0x3f800000;
    auVar294._28_4_ = 0x3f800000;
    auVar258 = vsubps_avx(auVar291,auVar72);
    fVar146 = auVar72._0_4_;
    fVar192 = auVar72._4_4_;
    fVar156 = auVar72._8_4_;
    fVar193 = auVar72._12_4_;
    fVar157 = auVar258._0_4_;
    fVar194 = auVar258._4_4_;
    fVar158 = auVar258._8_4_;
    fVar195 = auVar258._12_4_;
    auVar151._0_4_ = auVar283._0_4_ * fVar146 + fVar157 * fVar92;
    auVar151._4_4_ = auVar283._4_4_ * fVar192 + fVar194 * fVar117;
    auVar151._8_4_ = auVar283._0_4_ * fVar156 + fVar158 * fVar92;
    auVar151._12_4_ = auVar283._4_4_ * fVar193 + fVar195 * fVar117;
    auVar125._0_4_ = auVar236._0_4_ * fVar146 + fVar157 * fVar93;
    auVar125._4_4_ = auVar236._4_4_ * fVar192 + fVar194 * fVar118;
    auVar125._8_4_ = auVar236._0_4_ * fVar156 + fVar158 * fVar93;
    auVar125._12_4_ = auVar236._4_4_ * fVar193 + fVar195 * fVar118;
    auVar219._0_4_ = auVar95._0_4_ * fVar146 + auVar299._0_4_ * fVar157;
    auVar219._4_4_ = auVar95._4_4_ * fVar192 + auVar299._4_4_ * fVar194;
    auVar219._8_4_ = auVar95._0_4_ * fVar156 + auVar299._0_4_ * fVar158;
    auVar219._12_4_ = auVar95._4_4_ * fVar193 + auVar299._4_4_ * fVar195;
    auVar163._0_4_ = auVar67._0_4_ * fVar146 + auVar290._0_4_ * fVar157;
    auVar163._4_4_ = auVar67._4_4_ * fVar192 + auVar290._4_4_ * fVar194;
    auVar163._8_4_ = auVar67._0_4_ * fVar156 + auVar290._0_4_ * fVar158;
    auVar163._12_4_ = auVar67._4_4_ * fVar193 + auVar290._4_4_ * fVar195;
    auVar72 = vmovshdup_avx(auVar147);
    auVar258 = vshufps_avx(auVar147,auVar147,0);
    auVar240._16_16_ = auVar258;
    auVar240._0_16_ = auVar258;
    auVar142 = vshufps_avx(auVar147,auVar147,0x55);
    auVar85._16_16_ = auVar142;
    auVar85._0_16_ = auVar142;
    auVar84 = vsubps_avx(auVar85,auVar240);
    auVar142 = vshufps_avx(auVar151,auVar151,0);
    auVar66 = vshufps_avx(auVar151,auVar151,0x55);
    auVar98 = vshufps_avx(auVar125,auVar125,0);
    auVar128 = vshufps_avx(auVar125,auVar125,0x55);
    auVar99 = vshufps_avx(auVar219,auVar219,0);
    auVar120 = vshufps_avx(auVar219,auVar219,0x55);
    auVar119 = vshufps_avx(auVar163,auVar163,0);
    auVar121 = vshufps_avx(auVar163,auVar163,0x55);
    auVar72 = ZEXT416((uint)((auVar72._0_4_ - auVar273._0_4_) * 0.04761905));
    auVar72 = vshufps_avx(auVar72,auVar72,0);
    auVar251._0_4_ = auVar258._0_4_ + auVar84._0_4_ * 0.0;
    auVar251._4_4_ = auVar258._4_4_ + auVar84._4_4_ * 0.14285715;
    auVar251._8_4_ = auVar258._8_4_ + auVar84._8_4_ * 0.2857143;
    auVar251._12_4_ = auVar258._12_4_ + auVar84._12_4_ * 0.42857146;
    auVar251._16_4_ = auVar258._0_4_ + auVar84._16_4_ * 0.5714286;
    auVar251._20_4_ = auVar258._4_4_ + auVar84._20_4_ * 0.71428573;
    auVar251._24_4_ = auVar258._8_4_ + auVar84._24_4_ * 0.8571429;
    auVar251._28_4_ = auVar258._12_4_ + auVar84._28_4_;
    auVar18 = vsubps_avx(auVar294,auVar251);
    fVar146 = auVar98._0_4_;
    fVar156 = auVar98._4_4_;
    fVar157 = auVar98._8_4_;
    fVar158 = auVar98._12_4_;
    fVar295 = auVar18._0_4_;
    fVar296 = auVar18._4_4_;
    fVar297 = auVar18._8_4_;
    fVar242 = auVar18._12_4_;
    fVar243 = auVar18._16_4_;
    fVar244 = auVar18._20_4_;
    fVar245 = auVar18._24_4_;
    fVar274 = auVar128._0_4_;
    fVar276 = auVar128._4_4_;
    fVar285 = auVar128._8_4_;
    fVar287 = auVar128._12_4_;
    fVar288 = auVar66._12_4_ + 1.0;
    fVar266 = auVar99._0_4_;
    fVar267 = auVar99._4_4_;
    fVar268 = auVar99._8_4_;
    fVar269 = auVar99._12_4_;
    fVar208 = fVar266 * auVar251._0_4_ + fVar295 * fVar146;
    fVar209 = fVar267 * auVar251._4_4_ + fVar296 * fVar156;
    fVar210 = fVar268 * auVar251._8_4_ + fVar297 * fVar157;
    fVar246 = fVar269 * auVar251._12_4_ + fVar242 * fVar158;
    fVar252 = fVar266 * auVar251._16_4_ + fVar243 * fVar146;
    fVar253 = fVar267 * auVar251._20_4_ + fVar244 * fVar156;
    fVar254 = fVar268 * auVar251._24_4_ + fVar245 * fVar157;
    fVar192 = auVar120._0_4_;
    fVar193 = auVar120._4_4_;
    fVar194 = auVar120._8_4_;
    fVar195 = auVar120._12_4_;
    fVar275 = fVar274 * fVar295 + auVar251._0_4_ * fVar192;
    fVar281 = fVar276 * fVar296 + auVar251._4_4_ * fVar193;
    fVar286 = fVar285 * fVar297 + auVar251._8_4_ * fVar194;
    fVar289 = fVar287 * fVar242 + auVar251._12_4_ * fVar195;
    fVar277 = fVar274 * fVar243 + auVar251._16_4_ * fVar192;
    fVar278 = fVar276 * fVar244 + auVar251._20_4_ * fVar193;
    fVar279 = fVar285 * fVar245 + auVar251._24_4_ * fVar194;
    fVar280 = fVar287 + fVar158;
    auVar258 = vshufps_avx(auVar151,auVar151,0xaa);
    auVar98 = vshufps_avx(auVar151,auVar151,0xff);
    fVar255 = fVar269 + 0.0;
    auVar128 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar99 = vshufps_avx(auVar125,auVar125,0xff);
    auVar174._0_4_ =
         fVar295 * (auVar251._0_4_ * fVar146 + fVar295 * auVar142._0_4_) + auVar251._0_4_ * fVar208;
    auVar174._4_4_ =
         fVar296 * (auVar251._4_4_ * fVar156 + fVar296 * auVar142._4_4_) + auVar251._4_4_ * fVar209;
    auVar174._8_4_ =
         fVar297 * (auVar251._8_4_ * fVar157 + fVar297 * auVar142._8_4_) + auVar251._8_4_ * fVar210;
    auVar174._12_4_ =
         fVar242 * (auVar251._12_4_ * fVar158 + fVar242 * auVar142._12_4_) +
         auVar251._12_4_ * fVar246;
    auVar174._16_4_ =
         fVar243 * (auVar251._16_4_ * fVar146 + fVar243 * auVar142._0_4_) +
         auVar251._16_4_ * fVar252;
    auVar174._20_4_ =
         fVar244 * (auVar251._20_4_ * fVar156 + fVar244 * auVar142._4_4_) +
         auVar251._20_4_ * fVar253;
    auVar174._24_4_ =
         fVar245 * (auVar251._24_4_ * fVar157 + fVar245 * auVar142._8_4_) +
         auVar251._24_4_ * fVar254;
    auVar174._28_4_ = auVar142._12_4_ + 1.0 + fVar195;
    auVar190._0_4_ =
         fVar295 * (fVar274 * auVar251._0_4_ + auVar66._0_4_ * fVar295) + auVar251._0_4_ * fVar275;
    auVar190._4_4_ =
         fVar296 * (fVar276 * auVar251._4_4_ + auVar66._4_4_ * fVar296) + auVar251._4_4_ * fVar281;
    auVar190._8_4_ =
         fVar297 * (fVar285 * auVar251._8_4_ + auVar66._8_4_ * fVar297) + auVar251._8_4_ * fVar286;
    auVar190._12_4_ =
         fVar242 * (fVar287 * auVar251._12_4_ + auVar66._12_4_ * fVar242) +
         auVar251._12_4_ * fVar289;
    auVar190._16_4_ =
         fVar243 * (fVar274 * auVar251._16_4_ + auVar66._0_4_ * fVar243) + auVar251._16_4_ * fVar277
    ;
    auVar190._20_4_ =
         fVar244 * (fVar276 * auVar251._20_4_ + auVar66._4_4_ * fVar244) + auVar251._20_4_ * fVar278
    ;
    auVar190._24_4_ =
         fVar245 * (fVar285 * auVar251._24_4_ + auVar66._8_4_ * fVar245) + auVar251._24_4_ * fVar279
    ;
    auVar190._28_4_ = auVar121._12_4_ + fVar195;
    auVar86._0_4_ =
         fVar295 * fVar208 + auVar251._0_4_ * (fVar266 * fVar295 + auVar119._0_4_ * auVar251._0_4_);
    auVar86._4_4_ =
         fVar296 * fVar209 + auVar251._4_4_ * (fVar267 * fVar296 + auVar119._4_4_ * auVar251._4_4_);
    auVar86._8_4_ =
         fVar297 * fVar210 + auVar251._8_4_ * (fVar268 * fVar297 + auVar119._8_4_ * auVar251._8_4_);
    auVar86._12_4_ =
         fVar242 * fVar246 +
         auVar251._12_4_ * (fVar269 * fVar242 + auVar119._12_4_ * auVar251._12_4_);
    auVar86._16_4_ =
         fVar243 * fVar252 +
         auVar251._16_4_ * (fVar266 * fVar243 + auVar119._0_4_ * auVar251._16_4_);
    auVar86._20_4_ =
         fVar244 * fVar253 +
         auVar251._20_4_ * (fVar267 * fVar244 + auVar119._4_4_ * auVar251._20_4_);
    auVar86._24_4_ =
         fVar245 * fVar254 +
         auVar251._24_4_ * (fVar268 * fVar245 + auVar119._8_4_ * auVar251._24_4_);
    auVar86._28_4_ = fVar158 + 1.0 + fVar255;
    auVar264._0_4_ =
         fVar295 * fVar275 + auVar251._0_4_ * (auVar121._0_4_ * auVar251._0_4_ + fVar295 * fVar192);
    auVar264._4_4_ =
         fVar296 * fVar281 + auVar251._4_4_ * (auVar121._4_4_ * auVar251._4_4_ + fVar296 * fVar193);
    auVar264._8_4_ =
         fVar297 * fVar286 + auVar251._8_4_ * (auVar121._8_4_ * auVar251._8_4_ + fVar297 * fVar194);
    auVar264._12_4_ =
         fVar242 * fVar289 +
         auVar251._12_4_ * (auVar121._12_4_ * auVar251._12_4_ + fVar242 * fVar195);
    auVar264._16_4_ =
         fVar243 * fVar277 +
         auVar251._16_4_ * (auVar121._0_4_ * auVar251._16_4_ + fVar243 * fVar192);
    auVar264._20_4_ =
         fVar244 * fVar278 +
         auVar251._20_4_ * (auVar121._4_4_ * auVar251._20_4_ + fVar244 * fVar193);
    auVar264._24_4_ =
         fVar245 * fVar279 +
         auVar251._24_4_ * (auVar121._8_4_ * auVar251._24_4_ + fVar245 * fVar194);
    auVar264._28_4_ = fVar255 + fVar195 + 0.0;
    local_1e0._0_4_ = fVar295 * auVar174._0_4_ + auVar251._0_4_ * auVar86._0_4_;
    local_1e0._4_4_ = fVar296 * auVar174._4_4_ + auVar251._4_4_ * auVar86._4_4_;
    local_1e0._8_4_ = fVar297 * auVar174._8_4_ + auVar251._8_4_ * auVar86._8_4_;
    local_1e0._12_4_ = fVar242 * auVar174._12_4_ + auVar251._12_4_ * auVar86._12_4_;
    local_1e0._16_4_ = fVar243 * auVar174._16_4_ + auVar251._16_4_ * auVar86._16_4_;
    local_1e0._20_4_ = fVar244 * auVar174._20_4_ + auVar251._20_4_ * auVar86._20_4_;
    local_1e0._24_4_ = fVar245 * auVar174._24_4_ + auVar251._24_4_ * auVar86._24_4_;
    local_1e0._28_4_ = fVar280 + fVar195 + 0.0;
    auVar155._0_4_ = fVar295 * auVar190._0_4_ + auVar251._0_4_ * auVar264._0_4_;
    auVar155._4_4_ = fVar296 * auVar190._4_4_ + auVar251._4_4_ * auVar264._4_4_;
    auVar155._8_4_ = fVar297 * auVar190._8_4_ + auVar251._8_4_ * auVar264._8_4_;
    auVar155._12_4_ = fVar242 * auVar190._12_4_ + auVar251._12_4_ * auVar264._12_4_;
    auVar155._16_4_ = fVar243 * auVar190._16_4_ + auVar251._16_4_ * auVar264._16_4_;
    auVar155._20_4_ = fVar244 * auVar190._20_4_ + auVar251._20_4_ * auVar264._20_4_;
    auVar155._24_4_ = fVar245 * auVar190._24_4_ + auVar251._24_4_ * auVar264._24_4_;
    auVar155._28_4_ = fVar280 + fVar255;
    auVar19 = vsubps_avx(auVar86,auVar174);
    auVar84 = vsubps_avx(auVar264,auVar190);
    local_620 = auVar72._0_4_;
    fStack_61c = auVar72._4_4_;
    fStack_618 = auVar72._8_4_;
    fStack_614 = auVar72._12_4_;
    local_220 = local_620 * auVar19._0_4_ * 3.0;
    fStack_21c = fStack_61c * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_21c;
    auVar20._0_4_ = local_220;
    fStack_218 = fStack_618 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_218;
    fStack_214 = fStack_614 * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_214;
    fStack_210 = local_620 * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_210;
    fStack_20c = fStack_61c * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_20c;
    fStack_208 = fStack_618 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_208;
    auVar20._28_4_ = auVar19._28_4_;
    local_240 = local_620 * auVar84._0_4_ * 3.0;
    fStack_23c = fStack_61c * auVar84._4_4_ * 3.0;
    auVar21._4_4_ = fStack_23c;
    auVar21._0_4_ = local_240;
    fStack_238 = fStack_618 * auVar84._8_4_ * 3.0;
    auVar21._8_4_ = fStack_238;
    fStack_234 = fStack_614 * auVar84._12_4_ * 3.0;
    auVar21._12_4_ = fStack_234;
    fStack_230 = local_620 * auVar84._16_4_ * 3.0;
    auVar21._16_4_ = fStack_230;
    fStack_22c = fStack_61c * auVar84._20_4_ * 3.0;
    auVar21._20_4_ = fStack_22c;
    fStack_228 = fStack_618 * auVar84._24_4_ * 3.0;
    auVar21._24_4_ = fStack_228;
    auVar21._28_4_ = fVar280;
    auVar20 = vsubps_avx(local_1e0,auVar20);
    auVar84 = vperm2f128_avx(auVar20,auVar20,1);
    auVar84 = vshufps_avx(auVar84,auVar20,0x30);
    auVar84 = vshufps_avx(auVar20,auVar84,0x29);
    auVar21 = vsubps_avx(auVar155,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar20,0x29);
    fVar278 = auVar128._0_4_;
    fVar279 = auVar128._4_4_;
    fVar301 = auVar128._8_4_;
    fVar158 = auVar258._12_4_;
    fVar267 = auVar99._0_4_;
    fVar269 = auVar99._4_4_;
    fVar275 = auVar99._8_4_;
    fVar281 = auVar99._12_4_;
    auVar72 = vshufps_avx(auVar219,auVar219,0xaa);
    fVar146 = auVar72._0_4_;
    fVar156 = auVar72._4_4_;
    fVar157 = auVar72._8_4_;
    fVar195 = auVar72._12_4_;
    fVar210 = auVar251._0_4_ * fVar146 + fVar278 * fVar295;
    fVar246 = auVar251._4_4_ * fVar156 + fVar279 * fVar296;
    fVar252 = auVar251._8_4_ * fVar157 + fVar301 * fVar297;
    fVar253 = auVar251._12_4_ * fVar195 + auVar128._12_4_ * fVar242;
    fVar254 = auVar251._16_4_ * fVar146 + fVar278 * fVar243;
    fVar255 = auVar251._20_4_ * fVar156 + fVar279 * fVar244;
    fVar266 = auVar251._24_4_ * fVar157 + fVar301 * fVar245;
    auVar72 = vshufps_avx(auVar219,auVar219,0xff);
    fVar192 = auVar72._0_4_;
    fVar193 = auVar72._4_4_;
    fVar194 = auVar72._8_4_;
    fVar208 = auVar72._12_4_;
    fVar268 = auVar251._0_4_ * fVar192 + fVar267 * fVar295;
    fVar274 = auVar251._4_4_ * fVar193 + fVar269 * fVar296;
    fVar276 = auVar251._8_4_ * fVar194 + fVar275 * fVar297;
    fVar285 = auVar251._12_4_ * fVar208 + fVar281 * fVar242;
    fVar286 = auVar251._16_4_ * fVar192 + fVar267 * fVar243;
    fVar287 = auVar251._20_4_ * fVar193 + fVar269 * fVar244;
    fVar289 = auVar251._24_4_ * fVar194 + fVar275 * fVar245;
    auVar72 = vshufps_avx(auVar163,auVar163,0xaa);
    fVar277 = auVar72._12_4_ + fVar195;
    auVar142 = vshufps_avx(auVar163,auVar163,0xff);
    fVar209 = auVar142._12_4_;
    auVar87._0_4_ =
         fVar295 * (fVar278 * auVar251._0_4_ + fVar295 * auVar258._0_4_) + auVar251._0_4_ * fVar210;
    auVar87._4_4_ =
         fVar296 * (fVar279 * auVar251._4_4_ + fVar296 * auVar258._4_4_) + auVar251._4_4_ * fVar246;
    auVar87._8_4_ =
         fVar297 * (fVar301 * auVar251._8_4_ + fVar297 * auVar258._8_4_) + auVar251._8_4_ * fVar252;
    auVar87._12_4_ =
         fVar242 * (auVar128._12_4_ * auVar251._12_4_ + fVar242 * fVar158) +
         auVar251._12_4_ * fVar253;
    auVar87._16_4_ =
         fVar243 * (fVar278 * auVar251._16_4_ + fVar243 * auVar258._0_4_) +
         auVar251._16_4_ * fVar254;
    auVar87._20_4_ =
         fVar244 * (fVar279 * auVar251._20_4_ + fVar244 * auVar258._4_4_) +
         auVar251._20_4_ * fVar255;
    auVar87._24_4_ =
         fVar245 * (fVar301 * auVar251._24_4_ + fVar245 * auVar258._8_4_) +
         auVar251._24_4_ * fVar266;
    auVar87._28_4_ = auVar21._28_4_ + fVar158 + fVar209;
    auVar113._0_4_ =
         fVar295 * (fVar267 * auVar251._0_4_ + auVar98._0_4_ * fVar295) + auVar251._0_4_ * fVar268;
    auVar113._4_4_ =
         fVar296 * (fVar269 * auVar251._4_4_ + auVar98._4_4_ * fVar296) + auVar251._4_4_ * fVar274;
    auVar113._8_4_ =
         fVar297 * (fVar275 * auVar251._8_4_ + auVar98._8_4_ * fVar297) + auVar251._8_4_ * fVar276;
    auVar113._12_4_ =
         fVar242 * (fVar281 * auVar251._12_4_ + auVar98._12_4_ * fVar242) +
         auVar251._12_4_ * fVar285;
    auVar113._16_4_ =
         fVar243 * (fVar267 * auVar251._16_4_ + auVar98._0_4_ * fVar243) + auVar251._16_4_ * fVar286
    ;
    auVar113._20_4_ =
         fVar244 * (fVar269 * auVar251._20_4_ + auVar98._4_4_ * fVar244) + auVar251._20_4_ * fVar287
    ;
    auVar113._24_4_ =
         fVar245 * (fVar275 * auVar251._24_4_ + auVar98._8_4_ * fVar245) + auVar251._24_4_ * fVar289
    ;
    auVar113._28_4_ = fVar158 + auVar20._28_4_ + fVar209;
    auVar20 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar20 = vshufps_avx(auVar20,local_1e0,0x30);
    _local_520 = vshufps_avx(local_1e0,auVar20,0x29);
    auVar191._0_4_ =
         auVar251._0_4_ * (auVar72._0_4_ * auVar251._0_4_ + fVar295 * fVar146) + fVar295 * fVar210;
    auVar191._4_4_ =
         auVar251._4_4_ * (auVar72._4_4_ * auVar251._4_4_ + fVar296 * fVar156) + fVar296 * fVar246;
    auVar191._8_4_ =
         auVar251._8_4_ * (auVar72._8_4_ * auVar251._8_4_ + fVar297 * fVar157) + fVar297 * fVar252;
    auVar191._12_4_ =
         auVar251._12_4_ * (auVar72._12_4_ * auVar251._12_4_ + fVar242 * fVar195) +
         fVar242 * fVar253;
    auVar191._16_4_ =
         auVar251._16_4_ * (auVar72._0_4_ * auVar251._16_4_ + fVar243 * fVar146) + fVar243 * fVar254
    ;
    auVar191._20_4_ =
         auVar251._20_4_ * (auVar72._4_4_ * auVar251._20_4_ + fVar244 * fVar156) + fVar244 * fVar255
    ;
    auVar191._24_4_ =
         auVar251._24_4_ * (auVar72._8_4_ * auVar251._24_4_ + fVar245 * fVar157) + fVar245 * fVar266
    ;
    auVar191._28_4_ = fVar277 + fVar288 + auVar190._28_4_;
    auVar229._0_4_ =
         fVar295 * fVar268 + auVar251._0_4_ * (auVar251._0_4_ * auVar142._0_4_ + fVar295 * fVar192);
    auVar229._4_4_ =
         fVar296 * fVar274 + auVar251._4_4_ * (auVar251._4_4_ * auVar142._4_4_ + fVar296 * fVar193);
    auVar229._8_4_ =
         fVar297 * fVar276 + auVar251._8_4_ * (auVar251._8_4_ * auVar142._8_4_ + fVar297 * fVar194);
    auVar229._12_4_ =
         fVar242 * fVar285 + auVar251._12_4_ * (auVar251._12_4_ * fVar209 + fVar242 * fVar208);
    auVar229._16_4_ =
         fVar243 * fVar286 +
         auVar251._16_4_ * (auVar251._16_4_ * auVar142._0_4_ + fVar243 * fVar192);
    auVar229._20_4_ =
         fVar244 * fVar287 +
         auVar251._20_4_ * (auVar251._20_4_ * auVar142._4_4_ + fVar244 * fVar193);
    auVar229._24_4_ =
         fVar245 * fVar289 +
         auVar251._24_4_ * (auVar251._24_4_ * auVar142._8_4_ + fVar245 * fVar194);
    auVar229._28_4_ = fVar288 + fVar281 + fVar209 + fVar208;
    auVar222._0_4_ = fVar295 * auVar87._0_4_ + auVar251._0_4_ * auVar191._0_4_;
    auVar222._4_4_ = fVar296 * auVar87._4_4_ + auVar251._4_4_ * auVar191._4_4_;
    auVar222._8_4_ = fVar297 * auVar87._8_4_ + auVar251._8_4_ * auVar191._8_4_;
    auVar222._12_4_ = fVar242 * auVar87._12_4_ + auVar251._12_4_ * auVar191._12_4_;
    auVar222._16_4_ = fVar243 * auVar87._16_4_ + auVar251._16_4_ * auVar191._16_4_;
    auVar222._20_4_ = fVar244 * auVar87._20_4_ + auVar251._20_4_ * auVar191._20_4_;
    auVar222._24_4_ = fVar245 * auVar87._24_4_ + auVar251._24_4_ * auVar191._24_4_;
    auVar222._28_4_ = fVar277 + fVar209 + fVar208;
    auVar241._0_4_ = fVar295 * auVar113._0_4_ + auVar251._0_4_ * auVar229._0_4_;
    auVar241._4_4_ = fVar296 * auVar113._4_4_ + auVar251._4_4_ * auVar229._4_4_;
    auVar241._8_4_ = fVar297 * auVar113._8_4_ + auVar251._8_4_ * auVar229._8_4_;
    auVar241._12_4_ = fVar242 * auVar113._12_4_ + auVar251._12_4_ * auVar229._12_4_;
    auVar241._16_4_ = fVar243 * auVar113._16_4_ + auVar251._16_4_ * auVar229._16_4_;
    auVar241._20_4_ = fVar244 * auVar113._20_4_ + auVar251._20_4_ * auVar229._20_4_;
    auVar241._24_4_ = fVar245 * auVar113._24_4_ + auVar251._24_4_ * auVar229._24_4_;
    auVar241._28_4_ = auVar18._28_4_ + auVar251._28_4_;
    auVar22 = vsubps_avx(auVar191,auVar87);
    auVar20 = vsubps_avx(auVar229,auVar113);
    local_260 = local_620 * auVar22._0_4_ * 3.0;
    fStack_25c = fStack_61c * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_25c;
    auVar18._0_4_ = local_260;
    fStack_258 = fStack_618 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_258;
    fStack_254 = fStack_614 * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_254;
    fStack_250 = local_620 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_250;
    fStack_24c = fStack_61c * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_24c;
    fStack_248 = fStack_618 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_248;
    auVar18._28_4_ = auVar22._28_4_;
    local_280 = local_620 * auVar20._0_4_ * 3.0;
    fStack_27c = fStack_61c * auVar20._4_4_ * 3.0;
    auVar23._4_4_ = fStack_27c;
    auVar23._0_4_ = local_280;
    fStack_278 = fStack_618 * auVar20._8_4_ * 3.0;
    auVar23._8_4_ = fStack_278;
    fStack_274 = fStack_614 * auVar20._12_4_ * 3.0;
    auVar23._12_4_ = fStack_274;
    fStack_270 = local_620 * auVar20._16_4_ * 3.0;
    auVar23._16_4_ = fStack_270;
    fStack_26c = fStack_61c * auVar20._20_4_ * 3.0;
    auVar23._20_4_ = fStack_26c;
    fStack_268 = fStack_618 * auVar20._24_4_ * 3.0;
    auVar23._24_4_ = fStack_268;
    auVar23._28_4_ = auVar191._28_4_;
    auVar20 = vperm2f128_avx(auVar222,auVar222,1);
    auVar20 = vshufps_avx(auVar20,auVar222,0x30);
    auVar85 = vshufps_avx(auVar222,auVar20,0x29);
    auVar18 = vsubps_avx(auVar222,auVar18);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar20 = vshufps_avx(auVar18,auVar20,0x29);
    auVar23 = vsubps_avx(auVar241,auVar23);
    auVar18 = vperm2f128_avx(auVar23,auVar23,1);
    auVar18 = vshufps_avx(auVar18,auVar23,0x30);
    auVar23 = vshufps_avx(auVar23,auVar18,0x29);
    auVar24 = vsubps_avx(auVar222,local_1e0);
    auVar86 = vsubps_avx(auVar85,_local_520);
    fVar146 = auVar86._0_4_ + auVar24._0_4_;
    fVar192 = auVar86._4_4_ + auVar24._4_4_;
    fVar156 = auVar86._8_4_ + auVar24._8_4_;
    fVar193 = auVar86._12_4_ + auVar24._12_4_;
    fVar157 = auVar86._16_4_ + auVar24._16_4_;
    fVar194 = auVar86._20_4_ + auVar24._20_4_;
    fVar158 = auVar86._24_4_ + auVar24._24_4_;
    auVar18 = vperm2f128_avx(auVar155,auVar155,1);
    auVar18 = vshufps_avx(auVar18,auVar155,0x30);
    local_200 = vshufps_avx(auVar155,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar241,auVar241,1);
    auVar18 = vshufps_avx(auVar18,auVar241,0x30);
    local_1c0 = vshufps_avx(auVar241,auVar18,0x29);
    auVar18 = vsubps_avx(auVar241,auVar155);
    auVar87 = vsubps_avx(local_1c0,local_200);
    fVar195 = auVar87._0_4_ + auVar18._0_4_;
    fVar208 = auVar87._4_4_ + auVar18._4_4_;
    fVar209 = auVar87._8_4_ + auVar18._8_4_;
    fVar210 = auVar87._12_4_ + auVar18._12_4_;
    fVar246 = auVar87._16_4_ + auVar18._16_4_;
    fVar252 = auVar87._20_4_ + auVar18._20_4_;
    fVar253 = auVar87._24_4_ + auVar18._24_4_;
    auVar25._4_4_ = fVar192 * auVar155._4_4_;
    auVar25._0_4_ = fVar146 * auVar155._0_4_;
    auVar25._8_4_ = fVar156 * auVar155._8_4_;
    auVar25._12_4_ = fVar193 * auVar155._12_4_;
    auVar25._16_4_ = fVar157 * auVar155._16_4_;
    auVar25._20_4_ = fVar194 * auVar155._20_4_;
    auVar25._24_4_ = fVar158 * auVar155._24_4_;
    auVar25._28_4_ = auVar18._28_4_;
    auVar26._4_4_ = fVar208 * local_1e0._4_4_;
    auVar26._0_4_ = fVar195 * local_1e0._0_4_;
    auVar26._8_4_ = fVar209 * local_1e0._8_4_;
    auVar26._12_4_ = fVar210 * local_1e0._12_4_;
    auVar26._16_4_ = fVar246 * local_1e0._16_4_;
    auVar26._20_4_ = fVar252 * local_1e0._20_4_;
    auVar26._24_4_ = fVar253 * local_1e0._24_4_;
    auVar26._28_4_ = fVar277;
    auVar25 = vsubps_avx(auVar25,auVar26);
    local_220 = local_1e0._0_4_ + local_220;
    fStack_21c = local_1e0._4_4_ + fStack_21c;
    fStack_218 = local_1e0._8_4_ + fStack_218;
    fStack_214 = local_1e0._12_4_ + fStack_214;
    fStack_210 = local_1e0._16_4_ + fStack_210;
    fStack_20c = local_1e0._20_4_ + fStack_20c;
    fStack_208 = local_1e0._24_4_ + fStack_208;
    fStack_204 = local_1e0._28_4_ + auVar19._28_4_;
    local_240 = local_240 + auVar155._0_4_;
    fStack_23c = fStack_23c + auVar155._4_4_;
    fStack_238 = fStack_238 + auVar155._8_4_;
    fStack_234 = fStack_234 + auVar155._12_4_;
    fStack_230 = fStack_230 + auVar155._16_4_;
    fStack_22c = fStack_22c + auVar155._20_4_;
    fStack_228 = fStack_228 + auVar155._24_4_;
    fStack_224 = fVar280 + auVar155._28_4_;
    auVar19._4_4_ = fVar192 * fStack_23c;
    auVar19._0_4_ = fVar146 * local_240;
    auVar19._8_4_ = fVar156 * fStack_238;
    auVar19._12_4_ = fVar193 * fStack_234;
    auVar19._16_4_ = fVar157 * fStack_230;
    auVar19._20_4_ = fVar194 * fStack_22c;
    auVar19._24_4_ = fVar158 * fStack_228;
    auVar19._28_4_ = fVar280;
    auVar27._4_4_ = fVar208 * fStack_21c;
    auVar27._0_4_ = fVar195 * local_220;
    auVar27._8_4_ = fVar209 * fStack_218;
    auVar27._12_4_ = fVar210 * fStack_214;
    auVar27._16_4_ = fVar246 * fStack_210;
    auVar27._20_4_ = fVar252 * fStack_20c;
    auVar27._24_4_ = fVar253 * fStack_208;
    auVar27._28_4_ = fVar280 + auVar155._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar27);
    local_660 = auVar21._0_4_;
    fStack_65c = auVar21._4_4_;
    fStack_658 = auVar21._8_4_;
    fStack_654 = auVar21._12_4_;
    fStack_650 = auVar21._16_4_;
    fStack_64c = auVar21._20_4_;
    fStack_648 = auVar21._24_4_;
    auVar28._4_4_ = fVar192 * fStack_65c;
    auVar28._0_4_ = fVar146 * local_660;
    auVar28._8_4_ = fVar156 * fStack_658;
    auVar28._12_4_ = fVar193 * fStack_654;
    auVar28._16_4_ = fVar157 * fStack_650;
    auVar28._20_4_ = fVar194 * fStack_64c;
    auVar28._24_4_ = fVar158 * fStack_648;
    auVar28._28_4_ = fVar280;
    local_6a0 = auVar84._0_4_;
    fStack_69c = auVar84._4_4_;
    fStack_698 = auVar84._8_4_;
    fStack_694 = auVar84._12_4_;
    fStack_690 = auVar84._16_4_;
    fStack_68c = auVar84._20_4_;
    fStack_688 = auVar84._24_4_;
    auVar29._4_4_ = fVar208 * fStack_69c;
    auVar29._0_4_ = fVar195 * local_6a0;
    auVar29._8_4_ = fVar209 * fStack_698;
    auVar29._12_4_ = fVar210 * fStack_694;
    auVar29._16_4_ = fVar246 * fStack_690;
    auVar29._20_4_ = fVar252 * fStack_68c;
    auVar29._24_4_ = fVar253 * fStack_688;
    auVar29._28_4_ = local_1e0._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_200._4_4_ * fVar192;
    auVar30._0_4_ = local_200._0_4_ * fVar146;
    auVar30._8_4_ = local_200._8_4_ * fVar156;
    auVar30._12_4_ = local_200._12_4_ * fVar193;
    auVar30._16_4_ = local_200._16_4_ * fVar157;
    auVar30._20_4_ = local_200._20_4_ * fVar194;
    auVar30._24_4_ = local_200._24_4_ * fVar158;
    auVar30._28_4_ = fVar280;
    auVar31._4_4_ = local_520._4_4_ * fVar208;
    auVar31._0_4_ = local_520._0_4_ * fVar195;
    auVar31._8_4_ = local_520._8_4_ * fVar209;
    auVar31._12_4_ = local_520._12_4_ * fVar210;
    auVar31._16_4_ = local_520._16_4_ * fVar246;
    auVar31._20_4_ = local_520._20_4_ * fVar252;
    auVar31._24_4_ = local_520._24_4_ * fVar253;
    auVar31._28_4_ = local_200._28_4_;
    local_620 = auVar20._0_4_;
    fStack_61c = auVar20._4_4_;
    fStack_618 = auVar20._8_4_;
    fStack_614 = auVar20._12_4_;
    fStack_610 = auVar20._16_4_;
    fStack_60c = auVar20._20_4_;
    fStack_608 = auVar20._24_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar241._4_4_ * fVar192;
    auVar32._0_4_ = auVar241._0_4_ * fVar146;
    auVar32._8_4_ = auVar241._8_4_ * fVar156;
    auVar32._12_4_ = auVar241._12_4_ * fVar193;
    auVar32._16_4_ = auVar241._16_4_ * fVar157;
    auVar32._20_4_ = auVar241._20_4_ * fVar194;
    auVar32._24_4_ = auVar241._24_4_ * fVar158;
    auVar32._28_4_ = fVar280;
    auVar33._4_4_ = fVar208 * auVar222._4_4_;
    auVar33._0_4_ = fVar195 * auVar222._0_4_;
    auVar33._8_4_ = fVar209 * auVar222._8_4_;
    auVar33._12_4_ = fVar210 * auVar222._12_4_;
    auVar33._16_4_ = fVar246 * auVar222._16_4_;
    auVar33._20_4_ = fVar252 * auVar222._20_4_;
    auVar33._24_4_ = fVar253 * auVar222._24_4_;
    auVar33._28_4_ = fStack_204;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_260 = auVar222._0_4_ + local_260;
    fStack_25c = auVar222._4_4_ + fStack_25c;
    fStack_258 = auVar222._8_4_ + fStack_258;
    fStack_254 = auVar222._12_4_ + fStack_254;
    fStack_250 = auVar222._16_4_ + fStack_250;
    fStack_24c = auVar222._20_4_ + fStack_24c;
    fStack_248 = auVar222._24_4_ + fStack_248;
    fStack_244 = auVar222._28_4_ + auVar22._28_4_;
    local_280 = auVar241._0_4_ + local_280;
    fStack_27c = auVar241._4_4_ + fStack_27c;
    fStack_278 = auVar241._8_4_ + fStack_278;
    fStack_274 = auVar241._12_4_ + fStack_274;
    fStack_270 = auVar241._16_4_ + fStack_270;
    fStack_26c = auVar241._20_4_ + fStack_26c;
    fStack_268 = auVar241._24_4_ + fStack_268;
    fStack_264 = auVar241._28_4_ + auVar191._28_4_;
    auVar22._4_4_ = fVar192 * fStack_27c;
    auVar22._0_4_ = fVar146 * local_280;
    auVar22._8_4_ = fVar156 * fStack_278;
    auVar22._12_4_ = fVar193 * fStack_274;
    auVar22._16_4_ = fVar157 * fStack_270;
    auVar22._20_4_ = fVar194 * fStack_26c;
    auVar22._24_4_ = fVar158 * fStack_268;
    auVar22._28_4_ = auVar241._28_4_ + auVar191._28_4_;
    auVar34._4_4_ = fStack_25c * fVar208;
    auVar34._0_4_ = local_260 * fVar195;
    auVar34._8_4_ = fStack_258 * fVar209;
    auVar34._12_4_ = fStack_254 * fVar210;
    auVar34._16_4_ = fStack_250 * fVar246;
    auVar34._20_4_ = fStack_24c * fVar252;
    auVar34._24_4_ = fStack_248 * fVar253;
    auVar34._28_4_ = fStack_244;
    auVar22 = vsubps_avx(auVar22,auVar34);
    auVar35._4_4_ = fVar192 * auVar23._4_4_;
    auVar35._0_4_ = fVar146 * auVar23._0_4_;
    auVar35._8_4_ = fVar156 * auVar23._8_4_;
    auVar35._12_4_ = fVar193 * auVar23._12_4_;
    auVar35._16_4_ = fVar157 * auVar23._16_4_;
    auVar35._20_4_ = fVar194 * auVar23._20_4_;
    auVar35._24_4_ = fVar158 * auVar23._24_4_;
    auVar35._28_4_ = fStack_244;
    auVar36._4_4_ = fVar208 * fStack_61c;
    auVar36._0_4_ = fVar195 * local_620;
    auVar36._8_4_ = fVar209 * fStack_618;
    auVar36._12_4_ = fVar210 * fStack_614;
    auVar36._16_4_ = fVar246 * fStack_610;
    auVar36._20_4_ = fVar252 * fStack_60c;
    auVar36._24_4_ = fVar253 * fStack_608;
    auVar36._28_4_ = auVar23._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar192 * local_1c0._4_4_;
    auVar37._0_4_ = fVar146 * local_1c0._0_4_;
    auVar37._8_4_ = fVar156 * local_1c0._8_4_;
    auVar37._12_4_ = fVar193 * local_1c0._12_4_;
    auVar37._16_4_ = fVar157 * local_1c0._16_4_;
    auVar37._20_4_ = fVar194 * local_1c0._20_4_;
    auVar37._24_4_ = fVar158 * local_1c0._24_4_;
    auVar37._28_4_ = auVar86._28_4_ + auVar24._28_4_;
    auVar24._4_4_ = auVar85._4_4_ * fVar208;
    auVar24._0_4_ = auVar85._0_4_ * fVar195;
    auVar24._8_4_ = auVar85._8_4_ * fVar209;
    auVar24._12_4_ = auVar85._12_4_ * fVar210;
    auVar24._16_4_ = auVar85._16_4_ * fVar246;
    auVar24._20_4_ = auVar85._20_4_ * fVar252;
    auVar24._24_4_ = auVar85._24_4_ * fVar253;
    auVar24._28_4_ = auVar87._28_4_ + auVar18._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar20 = vminps_avx(auVar25,auVar19);
    auVar84 = vmaxps_avx(auVar25,auVar19);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar26,auVar27);
    auVar84 = vmaxps_avx(auVar84,auVar20);
    auVar18 = vminps_avx(auVar28,auVar22);
    auVar20 = vmaxps_avx(auVar28,auVar22);
    auVar19 = vminps_avx(auVar29,auVar24);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar29,auVar24);
    auVar20 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar84,auVar20);
    auVar84 = vcmpps_avx(auVar19,local_320,2);
    auVar20 = vcmpps_avx(auVar20,local_340,5);
    auVar84 = vandps_avx(auVar20,auVar84);
    auVar20 = local_2a0 & auVar84;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(_local_520,local_1e0);
      auVar21 = vsubps_avx(auVar85,auVar222);
      fVar192 = auVar20._0_4_ + auVar21._0_4_;
      fVar156 = auVar20._4_4_ + auVar21._4_4_;
      fVar193 = auVar20._8_4_ + auVar21._8_4_;
      fVar157 = auVar20._12_4_ + auVar21._12_4_;
      fVar194 = auVar20._16_4_ + auVar21._16_4_;
      fVar158 = auVar20._20_4_ + auVar21._20_4_;
      fVar195 = auVar20._24_4_ + auVar21._24_4_;
      auVar19 = vsubps_avx(local_200,auVar155);
      auVar22 = vsubps_avx(local_1c0,auVar241);
      fVar208 = auVar19._0_4_ + auVar22._0_4_;
      fVar209 = auVar19._4_4_ + auVar22._4_4_;
      fVar210 = auVar19._8_4_ + auVar22._8_4_;
      fVar246 = auVar19._12_4_ + auVar22._12_4_;
      fVar252 = auVar19._16_4_ + auVar22._16_4_;
      fVar253 = auVar19._20_4_ + auVar22._20_4_;
      fVar254 = auVar19._24_4_ + auVar22._24_4_;
      fVar146 = auVar22._28_4_;
      auVar38._4_4_ = auVar155._4_4_ * fVar156;
      auVar38._0_4_ = auVar155._0_4_ * fVar192;
      auVar38._8_4_ = auVar155._8_4_ * fVar193;
      auVar38._12_4_ = auVar155._12_4_ * fVar157;
      auVar38._16_4_ = auVar155._16_4_ * fVar194;
      auVar38._20_4_ = auVar155._20_4_ * fVar158;
      auVar38._24_4_ = auVar155._24_4_ * fVar195;
      auVar38._28_4_ = auVar155._28_4_;
      auVar39._4_4_ = local_1e0._4_4_ * fVar209;
      auVar39._0_4_ = local_1e0._0_4_ * fVar208;
      auVar39._8_4_ = local_1e0._8_4_ * fVar210;
      auVar39._12_4_ = local_1e0._12_4_ * fVar246;
      auVar39._16_4_ = local_1e0._16_4_ * fVar252;
      auVar39._20_4_ = local_1e0._20_4_ * fVar253;
      auVar39._24_4_ = local_1e0._24_4_ * fVar254;
      auVar39._28_4_ = local_1e0._28_4_;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar156 * fStack_23c;
      auVar40._0_4_ = fVar192 * local_240;
      auVar40._8_4_ = fVar193 * fStack_238;
      auVar40._12_4_ = fVar157 * fStack_234;
      auVar40._16_4_ = fVar194 * fStack_230;
      auVar40._20_4_ = fVar158 * fStack_22c;
      auVar40._24_4_ = fVar195 * fStack_228;
      auVar40._28_4_ = auVar155._28_4_;
      auVar41._4_4_ = fVar209 * fStack_21c;
      auVar41._0_4_ = fVar208 * local_220;
      auVar41._8_4_ = fVar210 * fStack_218;
      auVar41._12_4_ = fVar246 * fStack_214;
      auVar41._16_4_ = fVar252 * fStack_210;
      auVar41._20_4_ = fVar253 * fStack_20c;
      auVar41._24_4_ = fVar254 * fStack_208;
      auVar41._28_4_ = fVar146;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar156 * fStack_65c;
      auVar42._0_4_ = fVar192 * local_660;
      auVar42._8_4_ = fVar193 * fStack_658;
      auVar42._12_4_ = fVar157 * fStack_654;
      auVar42._16_4_ = fVar194 * fStack_650;
      auVar42._20_4_ = fVar158 * fStack_64c;
      auVar42._24_4_ = fVar195 * fStack_648;
      auVar42._28_4_ = fVar146;
      auVar43._4_4_ = fVar209 * fStack_69c;
      auVar43._0_4_ = fVar208 * local_6a0;
      auVar43._8_4_ = fVar210 * fStack_698;
      auVar43._12_4_ = fVar246 * fStack_694;
      auVar43._16_4_ = fVar252 * fStack_690;
      auVar43._20_4_ = fVar253 * fStack_68c;
      auVar43._24_4_ = fVar254 * fStack_688;
      auVar43._28_4_ = auVar18._28_4_;
      auVar86 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_200._4_4_ * fVar156;
      auVar44._0_4_ = local_200._0_4_ * fVar192;
      auVar44._8_4_ = local_200._8_4_ * fVar193;
      auVar44._12_4_ = local_200._12_4_ * fVar157;
      auVar44._16_4_ = local_200._16_4_ * fVar194;
      auVar44._20_4_ = local_200._20_4_ * fVar158;
      auVar44._24_4_ = local_200._24_4_ * fVar195;
      auVar44._28_4_ = auVar18._28_4_;
      auVar45._4_4_ = local_520._4_4_ * fVar209;
      auVar45._0_4_ = local_520._0_4_ * fVar208;
      auVar45._8_4_ = local_520._8_4_ * fVar210;
      auVar45._12_4_ = local_520._12_4_ * fVar246;
      auVar45._16_4_ = local_520._16_4_ * fVar252;
      auVar45._20_4_ = local_520._20_4_ * fVar253;
      uVar6 = local_520._28_4_;
      auVar45._24_4_ = local_520._24_4_ * fVar254;
      auVar45._28_4_ = uVar6;
      auVar87 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar241._4_4_ * fVar156;
      auVar46._0_4_ = auVar241._0_4_ * fVar192;
      auVar46._8_4_ = auVar241._8_4_ * fVar193;
      auVar46._12_4_ = auVar241._12_4_ * fVar157;
      auVar46._16_4_ = auVar241._16_4_ * fVar194;
      auVar46._20_4_ = auVar241._20_4_ * fVar158;
      auVar46._24_4_ = auVar241._24_4_ * fVar195;
      auVar46._28_4_ = uVar6;
      auVar47._4_4_ = auVar222._4_4_ * fVar209;
      auVar47._0_4_ = auVar222._0_4_ * fVar208;
      auVar47._8_4_ = auVar222._8_4_ * fVar210;
      auVar47._12_4_ = auVar222._12_4_ * fVar246;
      auVar47._16_4_ = auVar222._16_4_ * fVar252;
      auVar47._20_4_ = auVar222._20_4_ * fVar253;
      auVar47._24_4_ = auVar222._24_4_ * fVar254;
      auVar47._28_4_ = auVar222._28_4_;
      auVar25 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar156 * fStack_27c;
      auVar48._0_4_ = fVar192 * local_280;
      auVar48._8_4_ = fVar193 * fStack_278;
      auVar48._12_4_ = fVar157 * fStack_274;
      auVar48._16_4_ = fVar194 * fStack_270;
      auVar48._20_4_ = fVar158 * fStack_26c;
      auVar48._24_4_ = fVar195 * fStack_268;
      auVar48._28_4_ = uVar6;
      auVar49._4_4_ = fVar209 * fStack_25c;
      auVar49._0_4_ = fVar208 * local_260;
      auVar49._8_4_ = fVar210 * fStack_258;
      auVar49._12_4_ = fVar246 * fStack_254;
      auVar49._16_4_ = fVar252 * fStack_250;
      auVar49._20_4_ = fVar253 * fStack_24c;
      auVar49._24_4_ = fVar254 * fStack_248;
      auVar49._28_4_ = auVar241._28_4_;
      auVar26 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar156 * auVar23._4_4_;
      auVar50._0_4_ = fVar192 * auVar23._0_4_;
      auVar50._8_4_ = fVar193 * auVar23._8_4_;
      auVar50._12_4_ = fVar157 * auVar23._12_4_;
      auVar50._16_4_ = fVar194 * auVar23._16_4_;
      auVar50._20_4_ = fVar158 * auVar23._20_4_;
      auVar50._24_4_ = fVar195 * auVar23._24_4_;
      auVar50._28_4_ = auVar241._28_4_;
      auVar51._4_4_ = fStack_61c * fVar209;
      auVar51._0_4_ = local_620 * fVar208;
      auVar51._8_4_ = fStack_618 * fVar210;
      auVar51._12_4_ = fStack_614 * fVar246;
      auVar51._16_4_ = fStack_610 * fVar252;
      auVar51._20_4_ = fStack_60c * fVar253;
      auVar51._24_4_ = fStack_608 * fVar254;
      auVar51._28_4_ = local_200._28_4_;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = local_1c0._4_4_ * fVar156;
      auVar52._0_4_ = local_1c0._0_4_ * fVar192;
      auVar52._8_4_ = local_1c0._8_4_ * fVar193;
      auVar52._12_4_ = local_1c0._12_4_ * fVar157;
      auVar52._16_4_ = local_1c0._16_4_ * fVar194;
      auVar52._20_4_ = local_1c0._20_4_ * fVar158;
      auVar52._24_4_ = local_1c0._24_4_ * fVar195;
      auVar52._28_4_ = auVar20._28_4_ + auVar21._28_4_;
      auVar53._4_4_ = auVar85._4_4_ * fVar209;
      auVar53._0_4_ = auVar85._0_4_ * fVar208;
      auVar53._8_4_ = auVar85._8_4_ * fVar210;
      auVar53._12_4_ = auVar85._12_4_ * fVar246;
      auVar53._16_4_ = auVar85._16_4_ * fVar252;
      auVar53._20_4_ = auVar85._20_4_ * fVar253;
      auVar53._24_4_ = auVar85._24_4_ * fVar254;
      auVar53._28_4_ = auVar19._28_4_ + fVar146;
      auVar27 = vsubps_avx(auVar52,auVar53);
      auVar21 = vminps_avx(auVar22,auVar24);
      auVar20 = vmaxps_avx(auVar22,auVar24);
      auVar18 = vminps_avx(auVar86,auVar87);
      auVar18 = vminps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar86,auVar87);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar19 = vminps_avx(auVar25,auVar26);
      auVar21 = vmaxps_avx(auVar25,auVar26);
      auVar85 = vminps_avx(auVar23,auVar27);
      auVar19 = vminps_avx(auVar19,auVar85);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar23,auVar27);
      auVar21 = vmaxps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vcmpps_avx(auVar19,local_320,2);
      auVar21 = vcmpps_avx(auVar21,local_340,5);
      auVar20 = vandps_avx(auVar21,auVar20);
      auVar84 = vandps_avx(local_2a0,auVar84);
      auVar21 = auVar84 & auVar20;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar20,auVar84);
        uVar62 = vmovmskps_avx(auVar84);
        if (uVar62 != 0) {
          uVar58 = (ulong)uVar60;
          auStack_480[uVar58] = uVar62 & 0xff;
          uVar7 = vmovlps_avx(auVar147);
          *(undefined8 *)(afStack_300 + uVar58 * 2) = uVar7;
          uVar63 = vmovlps_avx(auVar122);
          auStack_1a0[uVar58] = uVar63;
          uVar60 = uVar60 + 1;
        }
      }
    }
    if (uVar60 != 0) {
      do {
        uVar58 = (ulong)(uVar60 - 1);
        uVar62 = auStack_480[uVar58];
        fVar146 = afStack_300[uVar58 * 2];
        fVar192 = afStack_300[uVar58 * 2 + 1];
        auVar259._8_8_ = 0;
        auVar259._0_8_ = auStack_1a0[uVar58];
        auVar265 = ZEXT1664(auVar259);
        uVar63 = 0;
        if (uVar62 != 0) {
          for (; (uVar62 >> uVar63 & 1) == 0; uVar63 = uVar63 + 1) {
          }
        }
        uVar62 = uVar62 - 1 & uVar62;
        auStack_480[uVar58] = uVar62;
        if (uVar62 == 0) {
          uVar60 = uVar60 - 1;
        }
        fVar193 = (float)(uVar63 + 1) * 0.14285715;
        fVar156 = (1.0 - (float)uVar63 * 0.14285715) * fVar146 +
                  fVar192 * (float)uVar63 * 0.14285715;
        fVar146 = (1.0 - fVar193) * fVar146 + fVar192 * fVar193;
        fVar192 = fVar146 - fVar156;
        if (0.16666667 <= fVar192) {
          auVar72 = vinsertps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar146),0x10);
          auVar273 = ZEXT1664(auVar72);
          goto LAB_00e0fc72;
        }
        auVar72 = vshufps_avx(auVar259,auVar259,0x50);
        auVar96._8_4_ = 0x3f800000;
        auVar96._0_8_ = 0x3f8000003f800000;
        auVar96._12_4_ = 0x3f800000;
        auVar258 = vsubps_avx(auVar96,auVar72);
        fVar193 = auVar72._0_4_;
        fVar157 = auVar72._4_4_;
        fVar194 = auVar72._8_4_;
        fVar158 = auVar72._12_4_;
        fVar195 = auVar258._0_4_;
        fVar208 = auVar258._4_4_;
        fVar209 = auVar258._8_4_;
        fVar210 = auVar258._12_4_;
        auVar126._0_4_ = fVar193 * auVar283._0_4_ + fVar195 * fVar92;
        auVar126._4_4_ = fVar157 * auVar283._4_4_ + fVar208 * fVar117;
        auVar126._8_4_ = fVar194 * auVar283._0_4_ + fVar209 * fVar92;
        auVar126._12_4_ = fVar158 * auVar283._4_4_ + fVar210 * fVar117;
        auVar164._0_4_ = fVar193 * auVar236._0_4_ + fVar195 * fVar93;
        auVar164._4_4_ = fVar157 * auVar236._4_4_ + fVar208 * fVar118;
        auVar164._8_4_ = fVar194 * auVar236._0_4_ + fVar209 * fVar93;
        auVar164._12_4_ = fVar158 * auVar236._4_4_ + fVar210 * fVar118;
        auVar184._0_4_ = fVar193 * auVar95._0_4_ + auVar299._0_4_ * fVar195;
        auVar184._4_4_ = fVar157 * auVar95._4_4_ + auVar299._4_4_ * fVar208;
        auVar184._8_4_ = fVar194 * auVar95._0_4_ + auVar299._0_4_ * fVar209;
        auVar184._12_4_ = fVar158 * auVar95._4_4_ + auVar299._4_4_ * fVar210;
        auVar69._0_4_ = auVar67._0_4_ * fVar193 + auVar290._0_4_ * fVar195;
        auVar69._4_4_ = auVar67._4_4_ * fVar157 + auVar290._4_4_ * fVar208;
        auVar69._8_4_ = auVar67._0_4_ * fVar194 + auVar290._0_4_ * fVar209;
        auVar69._12_4_ = auVar67._4_4_ * fVar158 + auVar290._4_4_ * fVar210;
        auVar114._16_16_ = auVar126;
        auVar114._0_16_ = auVar126;
        auVar143._16_16_ = auVar164;
        auVar143._0_16_ = auVar164;
        auVar175._16_16_ = auVar184;
        auVar175._0_16_ = auVar184;
        auVar84 = ZEXT2032(CONCAT416(fVar146,ZEXT416((uint)fVar156)));
        auVar84 = vshufps_avx(auVar84,auVar84,0);
        auVar20 = vsubps_avx(auVar143,auVar114);
        fVar193 = auVar84._0_4_;
        fVar157 = auVar84._4_4_;
        fVar194 = auVar84._8_4_;
        fVar158 = auVar84._12_4_;
        fVar195 = auVar84._16_4_;
        fVar208 = auVar84._20_4_;
        fVar209 = auVar84._24_4_;
        auVar115._0_4_ = auVar126._0_4_ + auVar20._0_4_ * fVar193;
        auVar115._4_4_ = auVar126._4_4_ + auVar20._4_4_ * fVar157;
        auVar115._8_4_ = auVar126._8_4_ + auVar20._8_4_ * fVar194;
        auVar115._12_4_ = auVar126._12_4_ + auVar20._12_4_ * fVar158;
        auVar115._16_4_ = auVar126._0_4_ + auVar20._16_4_ * fVar195;
        auVar115._20_4_ = auVar126._4_4_ + auVar20._20_4_ * fVar208;
        auVar115._24_4_ = auVar126._8_4_ + auVar20._24_4_ * fVar209;
        auVar115._28_4_ = auVar126._12_4_ + auVar20._28_4_;
        auVar84 = vsubps_avx(auVar175,auVar143);
        auVar144._0_4_ = auVar164._0_4_ + auVar84._0_4_ * fVar193;
        auVar144._4_4_ = auVar164._4_4_ + auVar84._4_4_ * fVar157;
        auVar144._8_4_ = auVar164._8_4_ + auVar84._8_4_ * fVar194;
        auVar144._12_4_ = auVar164._12_4_ + auVar84._12_4_ * fVar158;
        auVar144._16_4_ = auVar164._0_4_ + auVar84._16_4_ * fVar195;
        auVar144._20_4_ = auVar164._4_4_ + auVar84._20_4_ * fVar208;
        auVar144._24_4_ = auVar164._8_4_ + auVar84._24_4_ * fVar209;
        auVar144._28_4_ = auVar164._12_4_ + auVar84._28_4_;
        auVar72 = vsubps_avx(auVar69,auVar184);
        auVar88._0_4_ = auVar184._0_4_ + auVar72._0_4_ * fVar193;
        auVar88._4_4_ = auVar184._4_4_ + auVar72._4_4_ * fVar157;
        auVar88._8_4_ = auVar184._8_4_ + auVar72._8_4_ * fVar194;
        auVar88._12_4_ = auVar184._12_4_ + auVar72._12_4_ * fVar158;
        auVar88._16_4_ = auVar184._0_4_ + auVar72._0_4_ * fVar195;
        auVar88._20_4_ = auVar184._4_4_ + auVar72._4_4_ * fVar208;
        auVar88._24_4_ = auVar184._8_4_ + auVar72._8_4_ * fVar209;
        auVar88._28_4_ = auVar184._12_4_ + auVar72._12_4_;
        auVar84 = vsubps_avx(auVar144,auVar115);
        auVar116._0_4_ = auVar115._0_4_ + fVar193 * auVar84._0_4_;
        auVar116._4_4_ = auVar115._4_4_ + fVar157 * auVar84._4_4_;
        auVar116._8_4_ = auVar115._8_4_ + fVar194 * auVar84._8_4_;
        auVar116._12_4_ = auVar115._12_4_ + fVar158 * auVar84._12_4_;
        auVar116._16_4_ = auVar115._16_4_ + fVar195 * auVar84._16_4_;
        auVar116._20_4_ = auVar115._20_4_ + fVar208 * auVar84._20_4_;
        auVar116._24_4_ = auVar115._24_4_ + fVar209 * auVar84._24_4_;
        auVar116._28_4_ = auVar115._28_4_ + auVar84._28_4_;
        auVar84 = vsubps_avx(auVar88,auVar144);
        auVar89._0_4_ = auVar144._0_4_ + fVar193 * auVar84._0_4_;
        auVar89._4_4_ = auVar144._4_4_ + fVar157 * auVar84._4_4_;
        auVar89._8_4_ = auVar144._8_4_ + fVar194 * auVar84._8_4_;
        auVar89._12_4_ = auVar144._12_4_ + fVar158 * auVar84._12_4_;
        auVar89._16_4_ = auVar144._16_4_ + fVar195 * auVar84._16_4_;
        auVar89._20_4_ = auVar144._20_4_ + fVar208 * auVar84._20_4_;
        auVar89._24_4_ = auVar144._24_4_ + fVar209 * auVar84._24_4_;
        auVar89._28_4_ = auVar144._28_4_ + auVar84._28_4_;
        auVar84 = vsubps_avx(auVar89,auVar116);
        auVar202._0_4_ = auVar116._0_4_ + fVar193 * auVar84._0_4_;
        auVar202._4_4_ = auVar116._4_4_ + fVar157 * auVar84._4_4_;
        auVar202._8_4_ = auVar116._8_4_ + fVar194 * auVar84._8_4_;
        auVar202._12_4_ = auVar116._12_4_ + fVar158 * auVar84._12_4_;
        auVar207._16_4_ = auVar116._16_4_ + fVar195 * auVar84._16_4_;
        auVar207._0_16_ = auVar202;
        auVar207._20_4_ = auVar116._20_4_ + fVar208 * auVar84._20_4_;
        auVar207._24_4_ = auVar116._24_4_ + fVar209 * auVar84._24_4_;
        auVar207._28_4_ = auVar116._28_4_ + auVar144._28_4_;
        auVar120 = auVar207._16_16_;
        auVar98 = vshufps_avx(ZEXT416((uint)(fVar192 * 0.33333334)),
                              ZEXT416((uint)(fVar192 * 0.33333334)),0);
        auVar165._0_4_ = auVar202._0_4_ + auVar98._0_4_ * auVar84._0_4_ * 3.0;
        auVar165._4_4_ = auVar202._4_4_ + auVar98._4_4_ * auVar84._4_4_ * 3.0;
        auVar165._8_4_ = auVar202._8_4_ + auVar98._8_4_ * auVar84._8_4_ * 3.0;
        auVar165._12_4_ = auVar202._12_4_ + auVar98._12_4_ * auVar84._12_4_ * 3.0;
        auVar142 = vshufpd_avx(auVar202,auVar202,3);
        auVar66 = vshufpd_avx(auVar120,auVar120,3);
        _local_520 = auVar142;
        auVar72 = vsubps_avx(auVar142,auVar202);
        auVar258 = vsubps_avx(auVar66,auVar120);
        auVar70._0_4_ = auVar72._0_4_ + auVar258._0_4_;
        auVar70._4_4_ = auVar72._4_4_ + auVar258._4_4_;
        auVar70._8_4_ = auVar72._8_4_ + auVar258._8_4_;
        auVar70._12_4_ = auVar72._12_4_ + auVar258._12_4_;
        auVar72 = vmovshdup_avx(auVar202);
        auVar258 = vmovshdup_avx(auVar165);
        auVar128 = vshufps_avx(auVar70,auVar70,0);
        auVar99 = vshufps_avx(auVar70,auVar70,0x55);
        fVar193 = auVar99._0_4_;
        fVar157 = auVar99._4_4_;
        fVar194 = auVar99._8_4_;
        fVar158 = auVar99._12_4_;
        fVar195 = auVar128._0_4_;
        fVar208 = auVar128._4_4_;
        fVar209 = auVar128._8_4_;
        fVar210 = auVar128._12_4_;
        auVar71._0_4_ = fVar195 * auVar202._0_4_ + auVar72._0_4_ * fVar193;
        auVar71._4_4_ = fVar208 * auVar202._4_4_ + auVar72._4_4_ * fVar157;
        auVar71._8_4_ = fVar209 * auVar202._8_4_ + auVar72._8_4_ * fVar194;
        auVar71._12_4_ = fVar210 * auVar202._12_4_ + auVar72._12_4_ * fVar158;
        auVar260._0_4_ = fVar195 * auVar165._0_4_ + auVar258._0_4_ * fVar193;
        auVar260._4_4_ = fVar208 * auVar165._4_4_ + auVar258._4_4_ * fVar157;
        auVar260._8_4_ = fVar209 * auVar165._8_4_ + auVar258._8_4_ * fVar194;
        auVar260._12_4_ = fVar210 * auVar165._12_4_ + auVar258._12_4_ * fVar158;
        auVar258 = vshufps_avx(auVar71,auVar71,0xe8);
        auVar128 = vshufps_avx(auVar260,auVar260,0xe8);
        auVar72 = vcmpps_avx(auVar258,auVar128,1);
        uVar62 = vextractps_avx(auVar72,0);
        auVar99 = auVar260;
        if ((uVar62 & 1) == 0) {
          auVar99 = auVar71;
        }
        auVar97._0_4_ = auVar98._0_4_ * auVar84._16_4_ * 3.0;
        auVar97._4_4_ = auVar98._4_4_ * auVar84._20_4_ * 3.0;
        auVar97._8_4_ = auVar98._8_4_ * auVar84._24_4_ * 3.0;
        auVar97._12_4_ = auVar98._12_4_ * 0.0;
        auVar121 = vsubps_avx(auVar120,auVar97);
        auVar98 = vmovshdup_avx(auVar121);
        auVar120 = vmovshdup_avx(auVar120);
        fVar246 = auVar121._0_4_;
        fVar252 = auVar121._4_4_;
        auVar185._0_4_ = fVar246 * fVar195 + auVar98._0_4_ * fVar193;
        auVar185._4_4_ = fVar252 * fVar208 + auVar98._4_4_ * fVar157;
        auVar185._8_4_ = auVar121._8_4_ * fVar209 + auVar98._8_4_ * fVar194;
        auVar185._12_4_ = auVar121._12_4_ * fVar210 + auVar98._12_4_ * fVar158;
        auVar300._0_4_ = fVar195 * auVar207._16_4_ + auVar120._0_4_ * fVar193;
        auVar300._4_4_ = fVar208 * auVar207._20_4_ + auVar120._4_4_ * fVar157;
        auVar300._8_4_ = fVar209 * auVar207._24_4_ + auVar120._8_4_ * fVar194;
        auVar300._12_4_ = fVar210 * auVar207._28_4_ + auVar120._12_4_ * fVar158;
        auVar120 = vshufps_avx(auVar185,auVar185,0xe8);
        auVar119 = vshufps_avx(auVar300,auVar300,0xe8);
        auVar98 = vcmpps_avx(auVar120,auVar119,1);
        uVar62 = vextractps_avx(auVar98,0);
        auVar122 = auVar300;
        if ((uVar62 & 1) == 0) {
          auVar122 = auVar185;
        }
        auVar99 = vmaxss_avx(auVar122,auVar99);
        auVar258 = vminps_avx(auVar258,auVar128);
        auVar128 = vminps_avx(auVar120,auVar119);
        auVar128 = vminps_avx(auVar258,auVar128);
        auVar72 = vshufps_avx(auVar72,auVar72,0x55);
        auVar72 = vblendps_avx(auVar72,auVar98,2);
        auVar98 = vpslld_avx(auVar72,0x1f);
        auVar72 = vshufpd_avx(auVar260,auVar260,1);
        auVar72 = vinsertps_avx(auVar72,auVar300,0x9c);
        auVar258 = vshufpd_avx(auVar71,auVar71,1);
        auVar258 = vinsertps_avx(auVar258,auVar185,0x9c);
        auVar72 = vblendvps_avx(auVar258,auVar72,auVar98);
        auVar258 = vmovshdup_avx(auVar72);
        auVar72 = vmaxss_avx(auVar258,auVar72);
        fVar194 = auVar128._0_4_;
        auVar258 = vmovshdup_avx(auVar128);
        fVar157 = auVar72._0_4_;
        fVar158 = auVar258._0_4_;
        fVar193 = auVar99._0_4_;
        if ((0.0001 <= fVar194) || (fVar157 <= -0.0001)) {
          if ((fVar158 < 0.0001 && -0.0001 < fVar193) || (fVar194 < 0.0001 && -0.0001 < fVar193))
          goto LAB_00e10677;
          auVar98 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar72,1);
          auVar258 = vcmpps_avx(auVar258,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar258 = vandps_avx(auVar258,auVar98);
          if ((auVar258 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00e10677;
        }
        else {
LAB_00e10677:
          auVar98 = vcmpps_avx(auVar128,_DAT_01f7aa10,1);
          auVar258 = vcmpss_avx(auVar99,ZEXT416(0) << 0x20,1);
          auVar127._8_4_ = 0x3f800000;
          auVar127._0_8_ = 0x3f8000003f800000;
          auVar127._12_4_ = 0x3f800000;
          auVar166._8_4_ = 0xbf800000;
          auVar166._0_8_ = 0xbf800000bf800000;
          auVar166._12_4_ = 0xbf800000;
          auVar258 = vblendvps_avx(auVar127,auVar166,auVar258);
          auVar98 = vblendvps_avx(auVar127,auVar166,auVar98);
          auVar128 = vcmpss_avx(auVar98,auVar258,4);
          auVar128 = vpshufd_avx(ZEXT416(auVar128._0_4_ & 1),0x50);
          auVar128 = vpslld_avx(auVar128,0x1f);
          auVar128 = vpsrad_avx(auVar128,0x1f);
          auVar128 = vpandn_avx(auVar128,_DAT_01fafeb0);
          auVar99 = vmovshdup_avx(auVar98);
          fVar195 = auVar99._0_4_;
          if ((auVar98._0_4_ != fVar195) || (NAN(auVar98._0_4_) || NAN(fVar195))) {
            if ((fVar158 != fVar194) || (NAN(fVar158) || NAN(fVar194))) {
              fVar194 = -fVar194 / (fVar158 - fVar194);
              auVar98 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar194) * 0.0 + fVar194)));
            }
            else {
              auVar98 = ZEXT816(0x3f80000000000000);
              if ((fVar194 != 0.0) || (NAN(fVar194))) {
                auVar98 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar120 = vcmpps_avx(auVar128,auVar98,1);
            auVar99 = vblendps_avx(auVar128,auVar98,2);
            auVar98 = vblendps_avx(auVar98,auVar128,2);
            auVar128 = vblendvps_avx(auVar98,auVar99,auVar120);
          }
          auVar72 = vcmpss_avx(auVar72,ZEXT416(0) << 0x20,1);
          auVar129._8_4_ = 0x3f800000;
          auVar129._0_8_ = 0x3f8000003f800000;
          auVar129._12_4_ = 0x3f800000;
          auVar167._8_4_ = 0xbf800000;
          auVar167._0_8_ = 0xbf800000bf800000;
          auVar167._12_4_ = 0xbf800000;
          auVar72 = vblendvps_avx(auVar129,auVar167,auVar72);
          fVar194 = auVar72._0_4_;
          if ((auVar258._0_4_ != fVar194) || (NAN(auVar258._0_4_) || NAN(fVar194))) {
            if ((fVar157 != fVar193) || (NAN(fVar157) || NAN(fVar193))) {
              fVar193 = -fVar193 / (fVar157 - fVar193);
              auVar72 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar193) * 0.0 + fVar193)));
            }
            else {
              auVar72 = ZEXT816(0x3f80000000000000);
              if ((fVar193 != 0.0) || (NAN(fVar193))) {
                auVar72 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar98 = vcmpps_avx(auVar128,auVar72,1);
            auVar258 = vblendps_avx(auVar128,auVar72,2);
            auVar72 = vblendps_avx(auVar72,auVar128,2);
            auVar128 = vblendvps_avx(auVar72,auVar258,auVar98);
          }
          if ((fVar195 != fVar194) || (NAN(fVar195) || NAN(fVar194))) {
            auVar73._8_4_ = 0x3f800000;
            auVar73._0_8_ = 0x3f8000003f800000;
            auVar73._12_4_ = 0x3f800000;
            auVar72 = vcmpps_avx(auVar128,auVar73,1);
            auVar258 = vinsertps_avx(auVar128,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar130._4_12_ = auVar128._4_12_;
            auVar130._0_4_ = 0x3f800000;
            auVar128 = vblendvps_avx(auVar130,auVar258,auVar72);
          }
          auVar72 = vcmpps_avx(auVar128,_DAT_01f7b6f0,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar128._4_12_;
          auVar258 = vinsertps_avx(auVar128,ZEXT416(0x3f800000),0x10);
          auVar72 = vblendvps_avx(auVar258,auVar55 << 0x20,auVar72);
          auVar258 = vmovshdup_avx(auVar72);
          if (auVar72._0_4_ <= auVar258._0_4_) {
            auVar74._0_4_ = auVar72._0_4_ + -0.1;
            auVar74._4_4_ = auVar72._4_4_ + 0.1;
            auVar74._8_4_ = auVar72._8_4_ + 0.0;
            auVar74._12_4_ = auVar72._12_4_ + 0.0;
            auVar98 = vshufpd_avx(auVar165,auVar165,3);
            auVar203._8_8_ = 0x3f80000000000000;
            auVar203._0_8_ = 0x3f80000000000000;
            auVar72 = vcmpps_avx(auVar74,auVar203,1);
            auVar54._12_4_ = 0;
            auVar54._0_12_ = auVar74._4_12_;
            auVar258 = vinsertps_avx(auVar74,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar72 = vblendvps_avx(auVar258,auVar54 << 0x20,auVar72);
            auVar258 = vshufpd_avx(auVar121,auVar121,3);
            auVar128 = vshufps_avx(auVar72,auVar72,0x50);
            auVar204._8_4_ = 0x3f800000;
            auVar204._0_8_ = 0x3f8000003f800000;
            auVar204._12_4_ = 0x3f800000;
            auVar99 = vsubps_avx(auVar204,auVar128);
            local_520._0_4_ = auVar142._0_4_;
            local_520._4_4_ = auVar142._4_4_;
            fStack_518 = auVar142._8_4_;
            fStack_514 = auVar142._12_4_;
            fVar193 = auVar128._0_4_;
            fVar157 = auVar128._4_4_;
            fVar194 = auVar128._8_4_;
            fVar158 = auVar128._12_4_;
            local_680 = auVar66._0_4_;
            fStack_67c = auVar66._4_4_;
            fStack_678 = auVar66._8_4_;
            fStack_674 = auVar66._12_4_;
            fVar195 = auVar99._0_4_;
            fVar208 = auVar99._4_4_;
            fVar209 = auVar99._8_4_;
            fVar210 = auVar99._12_4_;
            auVar75._0_4_ = fVar193 * (float)local_520._0_4_ + fVar195 * auVar202._0_4_;
            auVar75._4_4_ = fVar157 * (float)local_520._4_4_ + fVar208 * auVar202._4_4_;
            auVar75._8_4_ = fVar194 * fStack_518 + fVar209 * auVar202._0_4_;
            auVar75._12_4_ = fVar158 * fStack_514 + fVar210 * auVar202._4_4_;
            auVar186._0_4_ = auVar98._0_4_ * fVar193 + fVar195 * auVar165._0_4_;
            auVar186._4_4_ = auVar98._4_4_ * fVar157 + fVar208 * auVar165._4_4_;
            auVar186._8_4_ = auVar98._8_4_ * fVar194 + fVar209 * auVar165._0_4_;
            auVar186._12_4_ = auVar98._12_4_ * fVar158 + fVar210 * auVar165._4_4_;
            auVar220._0_4_ = auVar258._0_4_ * fVar193 + fVar195 * fVar246;
            auVar220._4_4_ = auVar258._4_4_ * fVar157 + fVar208 * fVar252;
            auVar220._8_4_ = auVar258._8_4_ * fVar194 + fVar209 * fVar246;
            auVar220._12_4_ = auVar258._12_4_ * fVar158 + fVar210 * fVar252;
            auVar248._0_4_ = fVar193 * local_680 + fVar195 * auVar207._16_4_;
            auVar248._4_4_ = fVar157 * fStack_67c + fVar208 * auVar207._20_4_;
            auVar248._8_4_ = fVar194 * fStack_678 + fVar209 * auVar207._16_4_;
            auVar248._12_4_ = fVar158 * fStack_674 + fVar210 * auVar207._20_4_;
            auVar66 = vsubps_avx(auVar204,auVar72);
            auVar258 = vmovshdup_avx(auVar259);
            auVar142 = vmovsldup_avx(auVar259);
            auVar205._0_4_ = auVar66._0_4_ * auVar142._0_4_ + auVar72._0_4_ * auVar258._0_4_;
            auVar205._4_4_ = auVar66._4_4_ * auVar142._4_4_ + auVar72._4_4_ * auVar258._4_4_;
            auVar205._8_4_ = auVar66._8_4_ * auVar142._8_4_ + auVar72._8_4_ * auVar258._8_4_;
            auVar205._12_4_ = auVar66._12_4_ * auVar142._12_4_ + auVar72._12_4_ * auVar258._12_4_;
            auVar121 = vmovshdup_avx(auVar205);
            auVar72 = vsubps_avx(auVar186,auVar75);
            auVar131._0_4_ = auVar72._0_4_ * 3.0;
            auVar131._4_4_ = auVar72._4_4_ * 3.0;
            auVar131._8_4_ = auVar72._8_4_ * 3.0;
            auVar131._12_4_ = auVar72._12_4_ * 3.0;
            auVar72 = vsubps_avx(auVar220,auVar186);
            auVar152._0_4_ = auVar72._0_4_ * 3.0;
            auVar152._4_4_ = auVar72._4_4_ * 3.0;
            auVar152._8_4_ = auVar72._8_4_ * 3.0;
            auVar152._12_4_ = auVar72._12_4_ * 3.0;
            auVar72 = vsubps_avx(auVar248,auVar220);
            auVar227._0_4_ = auVar72._0_4_ * 3.0;
            auVar227._4_4_ = auVar72._4_4_ * 3.0;
            auVar227._8_4_ = auVar72._8_4_ * 3.0;
            auVar227._12_4_ = auVar72._12_4_ * 3.0;
            auVar258 = vminps_avx(auVar152,auVar227);
            auVar72 = vmaxps_avx(auVar152,auVar227);
            auVar258 = vminps_avx(auVar131,auVar258);
            auVar72 = vmaxps_avx(auVar131,auVar72);
            auVar142 = vshufpd_avx(auVar258,auVar258,3);
            auVar66 = vshufpd_avx(auVar72,auVar72,3);
            auVar258 = vminps_avx(auVar258,auVar142);
            auVar72 = vmaxps_avx(auVar72,auVar66);
            auVar142 = vshufps_avx(ZEXT416((uint)(1.0 / fVar192)),ZEXT416((uint)(1.0 / fVar192)),0);
            auVar228._0_4_ = auVar142._0_4_ * auVar258._0_4_;
            auVar228._4_4_ = auVar142._4_4_ * auVar258._4_4_;
            auVar228._8_4_ = auVar142._8_4_ * auVar258._8_4_;
            auVar228._12_4_ = auVar142._12_4_ * auVar258._12_4_;
            auVar237._0_4_ = auVar142._0_4_ * auVar72._0_4_;
            auVar237._4_4_ = auVar142._4_4_ * auVar72._4_4_;
            auVar237._8_4_ = auVar142._8_4_ * auVar72._8_4_;
            auVar237._12_4_ = auVar142._12_4_ * auVar72._12_4_;
            auVar99 = ZEXT416((uint)(1.0 / (auVar121._0_4_ - auVar205._0_4_)));
            auVar72 = vshufpd_avx(auVar75,auVar75,3);
            auVar258 = vshufpd_avx(auVar186,auVar186,3);
            auVar142 = vshufpd_avx(auVar220,auVar220,3);
            auVar66 = vshufpd_avx(auVar248,auVar248,3);
            auVar72 = vsubps_avx(auVar72,auVar75);
            auVar98 = vsubps_avx(auVar258,auVar186);
            auVar128 = vsubps_avx(auVar142,auVar220);
            auVar66 = vsubps_avx(auVar66,auVar248);
            auVar258 = vminps_avx(auVar72,auVar98);
            auVar72 = vmaxps_avx(auVar72,auVar98);
            auVar142 = vminps_avx(auVar128,auVar66);
            auVar142 = vminps_avx(auVar258,auVar142);
            auVar258 = vmaxps_avx(auVar128,auVar66);
            auVar72 = vmaxps_avx(auVar72,auVar258);
            auVar258 = vshufps_avx(auVar99,auVar99,0);
            auVar284._0_4_ = auVar258._0_4_ * auVar142._0_4_;
            auVar284._4_4_ = auVar258._4_4_ * auVar142._4_4_;
            auVar284._8_4_ = auVar258._8_4_ * auVar142._8_4_;
            auVar284._12_4_ = auVar258._12_4_ * auVar142._12_4_;
            auVar292._0_4_ = auVar258._0_4_ * auVar72._0_4_;
            auVar292._4_4_ = auVar258._4_4_ * auVar72._4_4_;
            auVar292._8_4_ = auVar258._8_4_ * auVar72._8_4_;
            auVar292._12_4_ = auVar258._12_4_ * auVar72._12_4_;
            auVar72 = vmovsldup_avx(auVar205);
            auVar249._4_12_ = auVar72._4_12_;
            auVar249._0_4_ = fVar156;
            auVar261._4_12_ = auVar205._4_12_;
            auVar261._0_4_ = fVar146;
            auVar153._0_4_ = (fVar156 + fVar146) * 0.5;
            auVar153._4_4_ = (auVar72._4_4_ + auVar205._4_4_) * 0.5;
            auVar153._8_4_ = (auVar72._8_4_ + auVar205._8_4_) * 0.5;
            auVar153._12_4_ = (auVar72._12_4_ + auVar205._12_4_) * 0.5;
            auVar72 = vshufps_avx(auVar153,auVar153,0);
            fVar193 = auVar72._0_4_;
            fVar157 = auVar72._4_4_;
            fVar194 = auVar72._8_4_;
            fVar158 = auVar72._12_4_;
            local_630 = auVar15._0_4_;
            fStack_62c = auVar15._4_4_;
            fStack_628 = auVar15._8_4_;
            fStack_624 = auVar15._12_4_;
            auVar100._0_4_ = fVar193 * (float)local_360._0_4_ + local_630;
            auVar100._4_4_ = fVar157 * (float)local_360._4_4_ + fStack_62c;
            auVar100._8_4_ = fVar194 * fStack_358 + fStack_628;
            auVar100._12_4_ = fVar158 * fStack_354 + fStack_624;
            local_6f0._0_4_ = auVar16._0_4_;
            local_6f0._4_4_ = auVar16._4_4_;
            fStack_6e8 = auVar16._8_4_;
            fStack_6e4 = auVar16._12_4_;
            auVar132._0_4_ = fVar193 * (float)local_370._0_4_ + (float)local_6f0._0_4_;
            auVar132._4_4_ = fVar157 * (float)local_370._4_4_ + (float)local_6f0._4_4_;
            auVar132._8_4_ = fVar194 * fStack_368 + fStack_6e8;
            auVar132._12_4_ = fVar158 * fStack_364 + fStack_6e4;
            local_640 = auVar17._0_4_;
            fStack_63c = auVar17._4_4_;
            fStack_638 = auVar17._8_4_;
            fStack_634 = auVar17._12_4_;
            auVar187._0_4_ = fVar193 * (float)local_380._0_4_ + local_640;
            auVar187._4_4_ = fVar157 * (float)local_380._4_4_ + fStack_63c;
            auVar187._8_4_ = fVar194 * fStack_378 + fStack_638;
            auVar187._12_4_ = fVar158 * fStack_374 + fStack_634;
            auVar72 = vsubps_avx(auVar132,auVar100);
            auVar101._0_4_ = auVar100._0_4_ + fVar193 * auVar72._0_4_;
            auVar101._4_4_ = auVar100._4_4_ + fVar157 * auVar72._4_4_;
            auVar101._8_4_ = auVar100._8_4_ + fVar194 * auVar72._8_4_;
            auVar101._12_4_ = auVar100._12_4_ + fVar158 * auVar72._12_4_;
            auVar72 = vsubps_avx(auVar187,auVar132);
            auVar133._0_4_ = auVar132._0_4_ + fVar193 * auVar72._0_4_;
            auVar133._4_4_ = auVar132._4_4_ + fVar157 * auVar72._4_4_;
            auVar133._8_4_ = auVar132._8_4_ + fVar194 * auVar72._8_4_;
            auVar133._12_4_ = auVar132._12_4_ + fVar158 * auVar72._12_4_;
            auVar72 = vsubps_avx(auVar133,auVar101);
            fVar193 = auVar101._0_4_ + fVar193 * auVar72._0_4_;
            fVar157 = auVar101._4_4_ + fVar157 * auVar72._4_4_;
            auVar76._0_8_ = CONCAT44(fVar157,fVar193);
            auVar76._8_4_ = auVar101._8_4_ + fVar194 * auVar72._8_4_;
            auVar76._12_4_ = auVar101._12_4_ + fVar158 * auVar72._12_4_;
            fVar194 = auVar72._0_4_ * 3.0;
            fVar158 = auVar72._4_4_ * 3.0;
            auVar102._0_8_ = CONCAT44(fVar158,fVar194);
            auVar102._8_4_ = auVar72._8_4_ * 3.0;
            auVar102._12_4_ = auVar72._12_4_ * 3.0;
            auVar134._8_8_ = auVar76._0_8_;
            auVar134._0_8_ = auVar76._0_8_;
            auVar72 = vshufpd_avx(auVar76,auVar76,3);
            auVar258 = vshufps_avx(auVar153,auVar153,0x55);
            auVar128 = vsubps_avx(auVar72,auVar134);
            auVar271._0_4_ = auVar128._0_4_ * auVar258._0_4_ + fVar193;
            auVar271._4_4_ = auVar128._4_4_ * auVar258._4_4_ + fVar157;
            auVar271._8_4_ = auVar128._8_4_ * auVar258._8_4_ + fVar193;
            auVar271._12_4_ = auVar128._12_4_ * auVar258._12_4_ + fVar157;
            auVar135._8_8_ = auVar102._0_8_;
            auVar135._0_8_ = auVar102._0_8_;
            auVar72 = vshufpd_avx(auVar102,auVar102,1);
            auVar72 = vsubps_avx(auVar72,auVar135);
            auVar103._0_4_ = auVar72._0_4_ * auVar258._0_4_ + fVar194;
            auVar103._4_4_ = auVar72._4_4_ * auVar258._4_4_ + fVar158;
            auVar103._8_4_ = auVar72._8_4_ * auVar258._8_4_ + fVar194;
            auVar103._12_4_ = auVar72._12_4_ * auVar258._12_4_ + fVar158;
            auVar258 = vmovshdup_avx(auVar103);
            auVar188._0_8_ = auVar258._0_8_ ^ 0x8000000080000000;
            auVar188._8_4_ = auVar258._8_4_ ^ 0x80000000;
            auVar188._12_4_ = auVar258._12_4_ ^ 0x80000000;
            auVar142 = vmovshdup_avx(auVar128);
            auVar72 = vunpcklps_avx(auVar142,auVar188);
            auVar66 = vshufps_avx(auVar72,auVar188,4);
            auVar77._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
            auVar77._8_4_ = -auVar128._8_4_;
            auVar77._12_4_ = -auVar128._12_4_;
            auVar72 = vmovlhps_avx(auVar77,auVar103);
            auVar98 = vshufps_avx(auVar72,auVar103,8);
            auVar72 = ZEXT416((uint)(auVar103._0_4_ * auVar142._0_4_ -
                                    auVar128._0_4_ * auVar258._0_4_));
            auVar258 = vshufps_avx(auVar72,auVar72,0);
            auVar72 = vdivps_avx(auVar66,auVar258);
            auVar258 = vdivps_avx(auVar98,auVar258);
            auVar98 = vinsertps_avx(auVar228,auVar284,0x1c);
            auVar128 = vinsertps_avx(auVar237,auVar292,0x1c);
            auVar99 = vinsertps_avx(auVar284,auVar228,0x4c);
            auVar120 = vinsertps_avx(auVar292,auVar237,0x4c);
            auVar142 = vmovsldup_avx(auVar72);
            auVar136._0_4_ = auVar142._0_4_ * auVar98._0_4_;
            auVar136._4_4_ = auVar142._4_4_ * auVar98._4_4_;
            auVar136._8_4_ = auVar142._8_4_ * auVar98._8_4_;
            auVar136._12_4_ = auVar142._12_4_ * auVar98._12_4_;
            auVar104._0_4_ = auVar128._0_4_ * auVar142._0_4_;
            auVar104._4_4_ = auVar128._4_4_ * auVar142._4_4_;
            auVar104._8_4_ = auVar128._8_4_ * auVar142._8_4_;
            auVar104._12_4_ = auVar128._12_4_ * auVar142._12_4_;
            auVar66 = vminps_avx(auVar136,auVar104);
            auVar142 = vmaxps_avx(auVar104,auVar136);
            auVar119 = vmovsldup_avx(auVar258);
            auVar293._0_4_ = auVar99._0_4_ * auVar119._0_4_;
            auVar293._4_4_ = auVar99._4_4_ * auVar119._4_4_;
            auVar293._8_4_ = auVar99._8_4_ * auVar119._8_4_;
            auVar293._12_4_ = auVar99._12_4_ * auVar119._12_4_;
            auVar137._0_4_ = auVar120._0_4_ * auVar119._0_4_;
            auVar137._4_4_ = auVar120._4_4_ * auVar119._4_4_;
            auVar137._8_4_ = auVar120._8_4_ * auVar119._8_4_;
            auVar137._12_4_ = auVar120._12_4_ * auVar119._12_4_;
            auVar119 = vminps_avx(auVar293,auVar137);
            auVar168._0_4_ = auVar66._0_4_ + auVar119._0_4_;
            auVar168._4_4_ = auVar66._4_4_ + auVar119._4_4_;
            auVar168._8_4_ = auVar66._8_4_ + auVar119._8_4_;
            auVar168._12_4_ = auVar66._12_4_ + auVar119._12_4_;
            auVar66 = vmaxps_avx(auVar137,auVar293);
            auVar119 = vsubps_avx(auVar249,auVar153);
            auVar122 = vsubps_avx(auVar261,auVar153);
            auVar105._0_4_ = auVar142._0_4_ + auVar66._0_4_;
            auVar105._4_4_ = auVar142._4_4_ + auVar66._4_4_;
            auVar105._8_4_ = auVar142._8_4_ + auVar66._8_4_;
            auVar105._12_4_ = auVar142._12_4_ + auVar66._12_4_;
            auVar138._8_8_ = 0x3f800000;
            auVar138._0_8_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar138,auVar105);
            auVar66 = vsubps_avx(auVar138,auVar168);
            fVar209 = auVar119._0_4_;
            auVar169._0_4_ = fVar209 * auVar142._0_4_;
            fVar210 = auVar119._4_4_;
            auVar169._4_4_ = fVar210 * auVar142._4_4_;
            fVar246 = auVar119._8_4_;
            auVar169._8_4_ = fVar246 * auVar142._8_4_;
            fVar252 = auVar119._12_4_;
            auVar169._12_4_ = fVar252 * auVar142._12_4_;
            fVar194 = auVar122._0_4_;
            auVar106._0_4_ = fVar194 * auVar142._0_4_;
            fVar158 = auVar122._4_4_;
            auVar106._4_4_ = fVar158 * auVar142._4_4_;
            fVar195 = auVar122._8_4_;
            auVar106._8_4_ = fVar195 * auVar142._8_4_;
            fVar208 = auVar122._12_4_;
            auVar106._12_4_ = fVar208 * auVar142._12_4_;
            auVar262._0_4_ = fVar209 * auVar66._0_4_;
            auVar262._4_4_ = fVar210 * auVar66._4_4_;
            auVar262._8_4_ = fVar246 * auVar66._8_4_;
            auVar262._12_4_ = fVar252 * auVar66._12_4_;
            auVar139._0_4_ = fVar194 * auVar66._0_4_;
            auVar139._4_4_ = fVar158 * auVar66._4_4_;
            auVar139._8_4_ = fVar195 * auVar66._8_4_;
            auVar139._12_4_ = fVar208 * auVar66._12_4_;
            auVar142 = vminps_avx(auVar169,auVar262);
            auVar66 = vminps_avx(auVar106,auVar139);
            auVar119 = vminps_avx(auVar142,auVar66);
            auVar142 = vmaxps_avx(auVar262,auVar169);
            auVar66 = vmaxps_avx(auVar139,auVar106);
            auVar122 = vshufps_avx(auVar153,auVar153,0x54);
            auVar66 = vmaxps_avx(auVar66,auVar142);
            auVar147 = vshufps_avx(auVar271,auVar271,0);
            auVar148 = vshufps_avx(auVar271,auVar271,0x55);
            auVar142 = vhaddps_avx(auVar119,auVar119);
            auVar66 = vhaddps_avx(auVar66,auVar66);
            auVar154._0_4_ = auVar147._0_4_ * auVar72._0_4_ + auVar148._0_4_ * auVar258._0_4_;
            auVar154._4_4_ = auVar147._4_4_ * auVar72._4_4_ + auVar148._4_4_ * auVar258._4_4_;
            auVar154._8_4_ = auVar147._8_4_ * auVar72._8_4_ + auVar148._8_4_ * auVar258._8_4_;
            auVar154._12_4_ = auVar147._12_4_ * auVar72._12_4_ + auVar148._12_4_ * auVar258._12_4_;
            auVar119 = vsubps_avx(auVar122,auVar154);
            fVar193 = auVar119._0_4_ + auVar142._0_4_;
            fVar157 = auVar119._0_4_ + auVar66._0_4_;
            auVar142 = vmaxss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar193));
            auVar66 = vminss_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar146));
            if (auVar142._0_4_ <= auVar66._0_4_) {
              auVar142 = vmovshdup_avx(auVar72);
              auVar78._0_4_ = auVar142._0_4_ * auVar98._0_4_;
              auVar78._4_4_ = auVar142._4_4_ * auVar98._4_4_;
              auVar78._8_4_ = auVar142._8_4_ * auVar98._8_4_;
              auVar78._12_4_ = auVar142._12_4_ * auVar98._12_4_;
              auVar107._0_4_ = auVar128._0_4_ * auVar142._0_4_;
              auVar107._4_4_ = auVar128._4_4_ * auVar142._4_4_;
              auVar107._8_4_ = auVar128._8_4_ * auVar142._8_4_;
              auVar107._12_4_ = auVar128._12_4_ * auVar142._12_4_;
              auVar66 = vminps_avx(auVar78,auVar107);
              auVar142 = vmaxps_avx(auVar107,auVar78);
              auVar98 = vmovshdup_avx(auVar258);
              auVar170._0_4_ = auVar99._0_4_ * auVar98._0_4_;
              auVar170._4_4_ = auVar99._4_4_ * auVar98._4_4_;
              auVar170._8_4_ = auVar99._8_4_ * auVar98._8_4_;
              auVar170._12_4_ = auVar99._12_4_ * auVar98._12_4_;
              auVar108._0_4_ = auVar120._0_4_ * auVar98._0_4_;
              auVar108._4_4_ = auVar120._4_4_ * auVar98._4_4_;
              auVar108._8_4_ = auVar120._8_4_ * auVar98._8_4_;
              auVar108._12_4_ = auVar120._12_4_ * auVar98._12_4_;
              auVar98 = vminps_avx(auVar170,auVar108);
              auVar140._0_4_ = auVar66._0_4_ + auVar98._0_4_;
              auVar140._4_4_ = auVar66._4_4_ + auVar98._4_4_;
              auVar140._8_4_ = auVar66._8_4_ + auVar98._8_4_;
              auVar140._12_4_ = auVar66._12_4_ + auVar98._12_4_;
              auVar66 = vmaxps_avx(auVar108,auVar170);
              auVar79._0_4_ = auVar142._0_4_ + auVar66._0_4_;
              auVar79._4_4_ = auVar142._4_4_ + auVar66._4_4_;
              auVar79._8_4_ = auVar142._8_4_ + auVar66._8_4_;
              auVar79._12_4_ = auVar142._12_4_ + auVar66._12_4_;
              auVar142 = vsubps_avx(auVar203,auVar79);
              auVar66 = vsubps_avx(auVar203,auVar140);
              auVar141._0_4_ = fVar209 * auVar142._0_4_;
              auVar141._4_4_ = fVar210 * auVar142._4_4_;
              auVar141._8_4_ = fVar246 * auVar142._8_4_;
              auVar141._12_4_ = fVar252 * auVar142._12_4_;
              auVar171._0_4_ = fVar209 * auVar66._0_4_;
              auVar171._4_4_ = fVar210 * auVar66._4_4_;
              auVar171._8_4_ = fVar246 * auVar66._8_4_;
              auVar171._12_4_ = fVar252 * auVar66._12_4_;
              auVar80._0_4_ = fVar194 * auVar142._0_4_;
              auVar80._4_4_ = fVar158 * auVar142._4_4_;
              auVar80._8_4_ = fVar195 * auVar142._8_4_;
              auVar80._12_4_ = fVar208 * auVar142._12_4_;
              auVar109._0_4_ = fVar194 * auVar66._0_4_;
              auVar109._4_4_ = fVar158 * auVar66._4_4_;
              auVar109._8_4_ = fVar195 * auVar66._8_4_;
              auVar109._12_4_ = fVar208 * auVar66._12_4_;
              auVar142 = vminps_avx(auVar141,auVar171);
              auVar66 = vminps_avx(auVar80,auVar109);
              auVar142 = vminps_avx(auVar142,auVar66);
              auVar66 = vmaxps_avx(auVar171,auVar141);
              auVar98 = vmaxps_avx(auVar109,auVar80);
              auVar142 = vhaddps_avx(auVar142,auVar142);
              auVar66 = vmaxps_avx(auVar98,auVar66);
              auVar66 = vhaddps_avx(auVar66,auVar66);
              auVar98 = vmovshdup_avx(auVar119);
              auVar128 = ZEXT416((uint)(auVar98._0_4_ + auVar142._0_4_));
              auVar142 = vmaxss_avx(auVar205,auVar128);
              auVar98 = ZEXT416((uint)(auVar98._0_4_ + auVar66._0_4_));
              auVar66 = vminss_avx(auVar98,auVar121);
              if (auVar142._0_4_ <= auVar66._0_4_) {
                bVar59 = 0;
                if ((fVar156 < fVar193) && (fVar157 < fVar146)) {
                  auVar142 = vcmpps_avx(auVar98,auVar121,1);
                  auVar66 = vcmpps_avx(auVar205,auVar128,1);
                  auVar142 = vandps_avx(auVar66,auVar142);
                  bVar59 = auVar142[0];
                }
                auVar265 = ZEXT1664(auVar205);
                if ((uVar60 < 4 && 0.001 <= fVar192) && (bVar59 & 1) == 0) goto LAB_00e11451;
                lVar57 = 200;
                do {
                  fVar192 = auVar119._0_4_;
                  fVar146 = 1.0 - fVar192;
                  auVar142 = ZEXT416((uint)(fVar146 * fVar146 * fVar146));
                  auVar142 = vshufps_avx(auVar142,auVar142,0);
                  auVar66 = ZEXT416((uint)(fVar192 * 3.0 * fVar146 * fVar146));
                  auVar66 = vshufps_avx(auVar66,auVar66,0);
                  auVar98 = ZEXT416((uint)(fVar146 * fVar192 * fVar192 * 3.0));
                  auVar98 = vshufps_avx(auVar98,auVar98,0);
                  auVar128 = ZEXT416((uint)(fVar192 * fVar192 * fVar192));
                  auVar128 = vshufps_avx(auVar128,auVar128,0);
                  local_5b0._0_4_ = auVar65._0_4_;
                  local_5b0._4_4_ = auVar65._4_4_;
                  fStack_5a8 = auVar65._8_4_;
                  fStack_5a4 = auVar65._12_4_;
                  fVar146 = auVar142._0_4_ * local_630 +
                            auVar66._0_4_ * (float)local_6f0._0_4_ +
                            auVar128._0_4_ * (float)local_5b0._0_4_ + auVar98._0_4_ * local_640;
                  fVar192 = auVar142._4_4_ * fStack_62c +
                            auVar66._4_4_ * (float)local_6f0._4_4_ +
                            auVar128._4_4_ * (float)local_5b0._4_4_ + auVar98._4_4_ * fStack_63c;
                  auVar81._0_8_ = CONCAT44(fVar192,fVar146);
                  auVar81._8_4_ =
                       auVar142._8_4_ * fStack_628 +
                       auVar66._8_4_ * fStack_6e8 +
                       auVar128._8_4_ * fStack_5a8 + auVar98._8_4_ * fStack_638;
                  auVar81._12_4_ =
                       auVar142._12_4_ * fStack_624 +
                       auVar66._12_4_ * fStack_6e4 +
                       auVar128._12_4_ * fStack_5a4 + auVar98._12_4_ * fStack_634;
                  auVar110._8_8_ = auVar81._0_8_;
                  auVar110._0_8_ = auVar81._0_8_;
                  auVar66 = vshufpd_avx(auVar81,auVar81,1);
                  auVar142 = vmovshdup_avx(auVar119);
                  auVar66 = vsubps_avx(auVar66,auVar110);
                  auVar82._0_4_ = auVar142._0_4_ * auVar66._0_4_ + fVar146;
                  auVar82._4_4_ = auVar142._4_4_ * auVar66._4_4_ + fVar192;
                  auVar82._8_4_ = auVar142._8_4_ * auVar66._8_4_ + fVar146;
                  auVar82._12_4_ = auVar142._12_4_ * auVar66._12_4_ + fVar192;
                  auVar142 = vshufps_avx(auVar82,auVar82,0);
                  auVar66 = vshufps_avx(auVar82,auVar82,0x55);
                  auVar111._0_4_ = auVar72._0_4_ * auVar142._0_4_ + auVar258._0_4_ * auVar66._0_4_;
                  auVar111._4_4_ = auVar72._4_4_ * auVar142._4_4_ + auVar258._4_4_ * auVar66._4_4_;
                  auVar111._8_4_ = auVar72._8_4_ * auVar142._8_4_ + auVar258._8_4_ * auVar66._8_4_;
                  auVar111._12_4_ =
                       auVar72._12_4_ * auVar142._12_4_ + auVar258._12_4_ * auVar66._12_4_;
                  auVar119 = vsubps_avx(auVar119,auVar111);
                  auVar112._8_4_ = 0x7fffffff;
                  auVar112._0_8_ = 0x7fffffff7fffffff;
                  auVar112._12_4_ = 0x7fffffff;
                  auVar142 = vandps_avx(auVar82,auVar112);
                  auVar66 = vshufps_avx(auVar142,auVar142,0xf5);
                  auVar142 = vmaxss_avx(auVar66,auVar142);
                  if (auVar142._0_4_ < (float)local_350._0_4_) {
                    fVar146 = auVar119._0_4_;
                    if ((fVar146 < 0.0) || (1.0 < fVar146)) break;
                    auVar72 = vmovshdup_avx(auVar119);
                    fVar192 = auVar72._0_4_;
                    if ((fVar192 < 0.0) || (1.0 < fVar192)) break;
                    auVar72 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar120 = vinsertps_avx(auVar72,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar72 = vdpps_avx(auVar120,local_390,0x7f);
                    auVar258 = vdpps_avx(auVar120,local_3a0,0x7f);
                    auVar142 = vdpps_avx(auVar120,local_3b0,0x7f);
                    auVar66 = vdpps_avx(auVar120,local_3c0,0x7f);
                    auVar98 = vdpps_avx(auVar120,local_3d0,0x7f);
                    auVar128 = vdpps_avx(auVar120,local_3e0,0x7f);
                    auVar99 = vdpps_avx(auVar120,local_3f0,0x7f);
                    auVar120 = vdpps_avx(auVar120,local_400,0x7f);
                    fVar158 = 1.0 - fVar192;
                    fVar195 = 1.0 - fVar146;
                    fVar156 = auVar119._4_4_;
                    fVar193 = auVar119._8_4_;
                    fVar157 = auVar119._12_4_;
                    fVar194 = fVar195 * fVar146 * fVar146 * 3.0;
                    auVar221._0_4_ = fVar146 * fVar146 * fVar146;
                    auVar221._4_4_ = fVar156 * fVar156 * fVar156;
                    auVar221._8_4_ = fVar193 * fVar193 * fVar193;
                    auVar221._12_4_ = fVar157 * fVar157 * fVar157;
                    fVar193 = fVar195 * fVar195 * fVar146 * 3.0;
                    fVar157 = fVar195 * fVar195 * fVar195;
                    fVar156 = fVar157 * (fVar158 * auVar72._0_4_ + fVar192 * auVar98._0_4_) +
                              (fVar158 * auVar258._0_4_ + auVar128._0_4_ * fVar192) * fVar193 +
                              fVar194 * (auVar99._0_4_ * fVar192 + fVar158 * auVar142._0_4_) +
                              auVar221._0_4_ * (fVar158 * auVar66._0_4_ + fVar192 * auVar120._0_4_);
                    if (((fVar156 < fVar176) ||
                        (fVar158 = *(float *)(ray + k * 4 + 0x100), fVar158 < fVar156)) ||
                       (pGVar10 = (context->scene->geometries).items[uVar56].ptr,
                       (pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0)) break;
                    auStack_f0 = vshufps_avx(auVar119,auVar119,0x55);
                    auVar238._8_4_ = 0x3f800000;
                    auVar238._0_8_ = 0x3f8000003f800000;
                    auVar238._12_4_ = 0x3f800000;
                    auVar72 = vsubps_avx(auVar238,auStack_f0);
                    fVar208 = auStack_f0._0_4_;
                    fVar209 = auStack_f0._4_4_;
                    fVar210 = auStack_f0._8_4_;
                    fVar246 = auStack_f0._12_4_;
                    fVar252 = auVar72._0_4_;
                    fVar253 = auVar72._4_4_;
                    fVar254 = auVar72._8_4_;
                    fVar255 = auVar72._12_4_;
                    auVar250._0_4_ =
                         fVar208 * (float)local_4a0._0_4_ + fVar252 * (float)local_490._0_4_;
                    auVar250._4_4_ =
                         fVar209 * (float)local_4a0._4_4_ + fVar253 * (float)local_490._4_4_;
                    auVar250._8_4_ = fVar210 * fStack_498 + fVar254 * fStack_488;
                    auVar250._12_4_ = fVar246 * fStack_494 + fVar255 * fStack_484;
                    auVar263._0_4_ =
                         fVar208 * (float)local_4f0._0_4_ + fVar252 * (float)local_4d0._0_4_;
                    auVar263._4_4_ =
                         fVar209 * (float)local_4f0._4_4_ + fVar253 * (float)local_4d0._4_4_;
                    auVar263._8_4_ = fVar210 * fStack_4e8 + fVar254 * fStack_4c8;
                    auVar263._12_4_ = fVar246 * fStack_4e4 + fVar255 * fStack_4c4;
                    auVar272._0_4_ =
                         fVar208 * (float)local_420._0_4_ + fVar252 * (float)local_4e0._0_4_;
                    auVar272._4_4_ =
                         fVar209 * (float)local_420._4_4_ + fVar253 * (float)local_4e0._4_4_;
                    auVar272._8_4_ = fVar210 * fStack_418 + fVar254 * fStack_4d8;
                    auVar272._12_4_ = fVar246 * fStack_414 + fVar255 * fStack_4d4;
                    auVar239._0_4_ =
                         fVar208 * (float)local_4c0._0_4_ + fVar252 * (float)local_4b0._0_4_;
                    auVar239._4_4_ =
                         fVar209 * (float)local_4c0._4_4_ + fVar253 * (float)local_4b0._4_4_;
                    auVar239._8_4_ = fVar210 * fStack_4b8 + fVar254 * fStack_4a8;
                    auVar239._12_4_ = fVar246 * fStack_4b4 + fVar255 * fStack_4a4;
                    auVar66 = vsubps_avx(auVar263,auVar250);
                    auVar98 = vsubps_avx(auVar272,auVar263);
                    auVar128 = vsubps_avx(auVar239,auVar272);
                    auStack_110 = vshufps_avx(auVar119,auVar119,0);
                    fVar246 = auStack_110._0_4_;
                    fVar252 = auStack_110._4_4_;
                    fVar253 = auStack_110._8_4_;
                    fVar254 = auStack_110._12_4_;
                    auVar72 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                    fVar195 = auVar72._0_4_;
                    fVar208 = auVar72._4_4_;
                    fVar209 = auVar72._8_4_;
                    fVar210 = auVar72._12_4_;
                    auVar72 = vshufps_avx(auVar221,auVar221,0);
                    auVar258 = vshufps_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),0);
                    auVar142 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
                    auVar206._0_4_ =
                         (fVar195 * (fVar195 * auVar66._0_4_ + fVar246 * auVar98._0_4_) +
                         fVar246 * (fVar195 * auVar98._0_4_ + fVar246 * auVar128._0_4_)) * 3.0;
                    auVar206._4_4_ =
                         (fVar208 * (fVar208 * auVar66._4_4_ + fVar252 * auVar98._4_4_) +
                         fVar252 * (fVar208 * auVar98._4_4_ + fVar252 * auVar128._4_4_)) * 3.0;
                    auVar206._8_4_ =
                         (fVar209 * (fVar209 * auVar66._8_4_ + fVar253 * auVar98._8_4_) +
                         fVar253 * (fVar209 * auVar98._8_4_ + fVar253 * auVar128._8_4_)) * 3.0;
                    auVar206._12_4_ =
                         (fVar210 * (fVar210 * auVar66._12_4_ + fVar254 * auVar98._12_4_) +
                         fVar254 * (fVar210 * auVar98._12_4_ + fVar254 * auVar128._12_4_)) * 3.0;
                    auVar66 = vshufps_avx(ZEXT416((uint)fVar157),ZEXT416((uint)fVar157),0);
                    auVar172._0_4_ =
                         auVar66._0_4_ * (float)local_430._0_4_ +
                         auVar142._0_4_ * (float)local_440._0_4_ +
                         auVar72._0_4_ * (float)local_460._0_4_ +
                         auVar258._0_4_ * (float)local_450._0_4_;
                    auVar172._4_4_ =
                         auVar66._4_4_ * (float)local_430._4_4_ +
                         auVar142._4_4_ * (float)local_440._4_4_ +
                         auVar72._4_4_ * (float)local_460._4_4_ +
                         auVar258._4_4_ * (float)local_450._4_4_;
                    auVar172._8_4_ =
                         auVar66._8_4_ * fStack_428 +
                         auVar142._8_4_ * fStack_438 +
                         auVar72._8_4_ * fStack_458 + auVar258._8_4_ * fStack_448;
                    auVar172._12_4_ =
                         auVar66._12_4_ * fStack_424 +
                         auVar142._12_4_ * fStack_434 +
                         auVar72._12_4_ * fStack_454 + auVar258._12_4_ * fStack_444;
                    auVar72 = vshufps_avx(auVar206,auVar206,0xc9);
                    auVar189._0_4_ = auVar172._0_4_ * auVar72._0_4_;
                    auVar189._4_4_ = auVar172._4_4_ * auVar72._4_4_;
                    auVar189._8_4_ = auVar172._8_4_ * auVar72._8_4_;
                    auVar189._12_4_ = auVar172._12_4_ * auVar72._12_4_;
                    auVar72 = vshufps_avx(auVar172,auVar172,0xc9);
                    auVar173._0_4_ = auVar206._0_4_ * auVar72._0_4_;
                    auVar173._4_4_ = auVar206._4_4_ * auVar72._4_4_;
                    auVar173._8_4_ = auVar206._8_4_ * auVar72._8_4_;
                    auVar173._12_4_ = auVar206._12_4_ * auVar72._12_4_;
                    auVar72 = vsubps_avx(auVar173,auVar189);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x100) = fVar156;
                      uVar6 = vextractps_avx(auVar72,1);
                      *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
                      uVar6 = vextractps_avx(auVar72,2);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
                      *(int *)(ray + k * 4 + 0x1c0) = auVar72._0_4_;
                      *(float *)(ray + k * 4 + 0x1e0) = fVar146;
                      *(float *)(ray + k * 4 + 0x200) = fVar192;
                      *(uint *)(ray + k * 4 + 0x220) = uVar9;
                      *(uint *)(ray + k * 4 + 0x240) = uVar56;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    auStack_170 = vshufps_avx(auVar72,auVar72,0x55);
                    auStack_150 = vshufps_avx(auVar72,auVar72,0xaa);
                    auStack_130 = vshufps_avx(auVar72,auVar72,0);
                    local_180[0] = (RTCHitN)auStack_170[0];
                    local_180[1] = (RTCHitN)auStack_170[1];
                    local_180[2] = (RTCHitN)auStack_170[2];
                    local_180[3] = (RTCHitN)auStack_170[3];
                    local_180[4] = (RTCHitN)auStack_170[4];
                    local_180[5] = (RTCHitN)auStack_170[5];
                    local_180[6] = (RTCHitN)auStack_170[6];
                    local_180[7] = (RTCHitN)auStack_170[7];
                    local_180[8] = (RTCHitN)auStack_170[8];
                    local_180[9] = (RTCHitN)auStack_170[9];
                    local_180[10] = (RTCHitN)auStack_170[10];
                    local_180[0xb] = (RTCHitN)auStack_170[0xb];
                    local_180[0xc] = (RTCHitN)auStack_170[0xc];
                    local_180[0xd] = (RTCHitN)auStack_170[0xd];
                    local_180[0xe] = (RTCHitN)auStack_170[0xe];
                    local_180[0xf] = (RTCHitN)auStack_170[0xf];
                    local_160 = auStack_150;
                    local_140 = auStack_130;
                    local_120 = auStack_110;
                    local_100 = auStack_f0;
                    local_e0 = local_2e0._0_8_;
                    uStack_d8 = local_2e0._8_8_;
                    uStack_d0 = local_2e0._16_8_;
                    uStack_c8 = local_2e0._24_8_;
                    local_c0 = local_2c0._0_8_;
                    uStack_b8 = local_2c0._8_8_;
                    uStack_b0 = local_2c0._16_8_;
                    uStack_a8 = local_2c0._24_8_;
                    auVar84 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                    uStack_9c = context->user->instID[0];
                    local_a0 = uStack_9c;
                    uStack_98 = uStack_9c;
                    uStack_94 = uStack_9c;
                    uStack_90 = uStack_9c;
                    uStack_8c = uStack_9c;
                    uStack_84 = auVar84._28_4_;
                    uVar62 = uStack_84;
                    uStack_88 = uStack_9c;
                    uStack_84 = uStack_9c;
                    uStack_7c = context->user->instPrimID[0];
                    local_80 = uStack_7c;
                    uStack_78 = uStack_7c;
                    uStack_74 = uStack_7c;
                    uStack_70 = uStack_7c;
                    uStack_6c = uStack_7c;
                    uStack_68 = uStack_7c;
                    uStack_64 = uStack_7c;
                    *(float *)(ray + k * 4 + 0x100) = fVar156;
                    local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar61 & 0xf) << 4));
                    local_570 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)((int)uVar61 >> 4) * 0x10);
                    local_550.valid = (int *)local_580;
                    local_550.geometryUserPtr = pGVar10->userPtr;
                    local_550.context = context->user;
                    local_550.hit = local_180;
                    local_550.N = 8;
                    local_550.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar10->intersectionFilterN)(&local_550);
                    }
                    auVar72 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                    auVar258 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                    auVar145._16_16_ = auVar258;
                    auVar145._0_16_ = auVar72;
                    auVar20 = auVar84 & ~auVar145;
                    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0x7f,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar20 >> 0xbf,0) != '\0') ||
                        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar20[0x1f] < '\0') {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_550);
                      }
                      auVar72 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                      auVar258 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                      auVar90._16_16_ = auVar258;
                      auVar90._0_16_ = auVar72;
                      auVar20 = auVar84 & ~auVar90;
                      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar20 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar20 >> 0x7f,0) != '\0') ||
                            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar20 >> 0xbf,0) != '\0') ||
                          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar20[0x1f] < '\0') {
                        auVar91._0_4_ = auVar72._0_4_ ^ auVar84._0_4_;
                        auVar91._4_4_ = auVar72._4_4_ ^ auVar84._4_4_;
                        auVar91._8_4_ = auVar72._8_4_ ^ auVar84._8_4_;
                        auVar91._12_4_ = auVar72._12_4_ ^ auVar84._12_4_;
                        auVar91._16_4_ = auVar258._0_4_ ^ auVar84._16_4_;
                        auVar91._20_4_ = auVar258._4_4_ ^ auVar84._20_4_;
                        auVar91._24_4_ = auVar258._8_4_ ^ auVar84._24_4_;
                        auVar91._28_4_ = auVar258._12_4_ ^ uVar62;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])local_550.hit);
                        *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0x20));
                        *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0x40));
                        *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0x60));
                        *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0x80));
                        *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0xa0));
                        *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0xc0));
                        *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0xe0));
                        *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar84;
                        auVar84 = vmaskmovps_avx(auVar91,*(undefined1 (*) [32])
                                                          (local_550.hit + 0x100));
                        *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar84;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar158;
                    break;
                  }
                  lVar57 = lVar57 + -1;
                } while (lVar57 != 0);
              }
            }
          }
        }
        if (uVar60 == 0) break;
      } while( true );
    }
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar83._4_4_ = uVar6;
    auVar83._0_4_ = uVar6;
    auVar83._8_4_ = uVar6;
    auVar83._12_4_ = uVar6;
    auVar72 = vcmpps_avx(local_470,auVar83,2);
    uVar56 = vmovmskps_avx(auVar72);
    uVar56 = (uint)uVar64 & uVar56;
    if (uVar56 == 0) {
      return;
    }
  } while( true );
LAB_00e11451:
  auVar72 = vinsertps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar146),0x10);
  auVar273 = ZEXT1664(auVar72);
  goto LAB_00e0fc72;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }